

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  __int_type_conflict _Var13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  RayQueryContext *pRVar65;
  byte bVar66;
  long lVar67;
  long lVar68;
  bool bVar69;
  ulong uVar70;
  Geometry *pGVar71;
  ulong uVar72;
  Geometry *geometry;
  long lVar73;
  byte bVar74;
  ulong uVar75;
  ulong uVar76;
  float fVar77;
  float fVar78;
  float fVar130;
  float fVar132;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar83 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar84 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar136;
  float fVar137;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined4 uVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined8 uVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar164 [32];
  float fVar165;
  uint uVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5f0 [16];
  Precalculations *local_5e0;
  ulong local_5d8;
  undefined1 local_5d0 [16];
  Geometry *local_5c0;
  RayQueryContext *local_5b8;
  RTCFilterFunctionNArguments local_5b0;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  LinearSpace3fa *local_450;
  Primitive *local_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2b0 [16];
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar76 = (ulong)(byte)prim[1];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar80);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar97 = vpmovsxbd_avx2(auVar79);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar103 = vpmovsxbd_avx2(auVar81);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar76 * 0xf + 6);
  auVar102 = vpmovsxbd_avx2(auVar7);
  lVar67 = uVar76 * 0x25;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar101 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar76 * 0x11 + 6);
  auVar98 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar76 * 0x1a + 6);
  auVar99 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar76 * 0x1b + 6);
  auVar92 = vpmovsxbd_avx2(auVar11);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar76 * 0x1c + 6);
  auVar93 = vpmovsxbd_avx2(auVar82);
  uVar138 = *(undefined4 *)(prim + lVar67 + 0x12);
  auVar83._4_4_ = uVar138;
  auVar83._0_4_ = uVar138;
  auVar83._8_4_ = uVar138;
  auVar83._12_4_ = uVar138;
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar79 = vsubps_avx512vl(auVar80,*(undefined1 (*) [16])(prim + lVar67 + 6));
  fVar150 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xb + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xd + 6));
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x12 + 6));
  auVar80 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar80 = vinsertps_avx512f(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar79 = vmulps_avx512vl(auVar83,auVar79);
  auVar80 = vmulps_avx512vl(auVar83,auVar80);
  auVar87 = vcvtdq2ps_avx512vl(auVar100);
  auVar88 = vcvtdq2ps_avx512vl(auVar97);
  auVar89 = vcvtdq2ps_avx512vl(auVar103);
  auVar90 = vcvtdq2ps_avx512vl(auVar102);
  auVar91 = vcvtdq2ps_avx512vl(auVar101);
  auVar100 = vcvtdq2ps_avx(auVar98);
  auVar103 = vcvtdq2ps_avx(auVar99);
  auVar102 = vcvtdq2ps_avx(auVar92);
  auVar101 = vcvtdq2ps_avx(auVar93);
  uVar138 = auVar80._0_4_;
  auVar171._4_4_ = uVar138;
  auVar171._0_4_ = uVar138;
  auVar171._8_4_ = uVar138;
  auVar171._12_4_ = uVar138;
  auVar171._16_4_ = uVar138;
  auVar171._20_4_ = uVar138;
  auVar171._24_4_ = uVar138;
  auVar171._28_4_ = uVar138;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar93 = vpermps_avx512vl(auVar92,ZEXT1632(auVar80));
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = vpermps_avx512vl(auVar94,ZEXT1632(auVar80));
  auVar96 = vmulps_avx512vl(auVar95,auVar89);
  auVar98._4_4_ = auVar95._4_4_ * auVar100._4_4_;
  auVar98._0_4_ = auVar95._0_4_ * auVar100._0_4_;
  auVar98._8_4_ = auVar95._8_4_ * auVar100._8_4_;
  auVar98._12_4_ = auVar95._12_4_ * auVar100._12_4_;
  auVar98._16_4_ = auVar95._16_4_ * auVar100._16_4_;
  auVar98._20_4_ = auVar95._20_4_ * auVar100._20_4_;
  auVar98._24_4_ = auVar95._24_4_ * auVar100._24_4_;
  auVar98._28_4_ = auVar97._28_4_;
  auVar99._4_4_ = auVar101._4_4_ * auVar95._4_4_;
  auVar99._0_4_ = auVar101._0_4_ * auVar95._0_4_;
  auVar99._8_4_ = auVar101._8_4_ * auVar95._8_4_;
  auVar99._12_4_ = auVar101._12_4_ * auVar95._12_4_;
  auVar99._16_4_ = auVar101._16_4_ * auVar95._16_4_;
  auVar99._20_4_ = auVar101._20_4_ * auVar95._20_4_;
  auVar99._24_4_ = auVar101._24_4_ * auVar95._24_4_;
  auVar99._28_4_ = auVar95._28_4_;
  auVar97 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar88);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar91);
  auVar80 = vfmadd231ps_fma(auVar99,auVar102,auVar93);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar171,auVar87);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar171,auVar90);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar103,auVar171);
  auVar99 = vbroadcastss_avx512vl(auVar79);
  auVar92 = vpermps_avx512vl(auVar92,ZEXT1632(auVar79));
  auVar93 = vpermps_avx512vl(auVar94,ZEXT1632(auVar79));
  auVar89 = vmulps_avx512vl(auVar93,auVar89);
  auVar100 = vmulps_avx512vl(auVar93,auVar100);
  auVar101 = vmulps_avx512vl(auVar93,auVar101);
  auVar93 = vfmadd231ps_avx512vl(auVar89,auVar92,auVar88);
  auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar91);
  auVar102 = vfmadd231ps_avx512vl(auVar101,auVar92,auVar102);
  auVar101 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar87);
  auVar87 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar90);
  auVar83 = vfmadd231ps_fma(auVar102,auVar99,auVar103);
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  auVar100 = vandps_avx(auVar94,auVar97);
  auVar91._8_4_ = 0x219392ef;
  auVar91._0_8_ = 0x219392ef219392ef;
  auVar91._12_4_ = 0x219392ef;
  auVar91._16_4_ = 0x219392ef;
  auVar91._20_4_ = 0x219392ef;
  auVar91._24_4_ = 0x219392ef;
  auVar91._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar100,auVar91,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar88._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._12_4_;
  bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
  auVar88._16_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._16_4_;
  bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
  auVar88._20_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._20_4_;
  bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
  auVar88._24_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._24_4_;
  bVar69 = SUB81(uVar72 >> 7,0);
  auVar88._28_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar97._28_4_;
  auVar100 = vandps_avx(auVar94,auVar98);
  uVar72 = vcmpps_avx512vl(auVar100,auVar91,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar89._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._12_4_;
  bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
  auVar89._16_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._16_4_;
  bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
  auVar89._20_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._20_4_;
  bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
  auVar89._24_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._24_4_;
  bVar69 = SUB81(uVar72 >> 7,0);
  auVar89._28_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._28_4_;
  auVar100 = vandps_avx(auVar94,ZEXT1632(auVar80));
  uVar72 = vcmpps_avx512vl(auVar100,auVar91,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar100._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar80._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar102 = vrcp14ps_avx512vl(auVar88);
  auVar97 = vfnmadd213ps_avx512vl(auVar88,auVar102,auVar103);
  auVar80 = vfmadd132ps_fma(auVar97,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar89);
  auVar97 = vfnmadd213ps_avx512vl(auVar89,auVar102,auVar103);
  auVar79 = vfmadd132ps_fma(auVar97,auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar100 = vfnmadd213ps_avx512vl(auVar100,auVar102,auVar103);
  auVar81 = vfmadd132ps_fma(auVar100,auVar102,auVar102);
  auVar90._4_4_ = fVar150;
  auVar90._0_4_ = fVar150;
  auVar90._8_4_ = fVar150;
  auVar90._12_4_ = fVar150;
  auVar90._16_4_ = fVar150;
  auVar90._20_4_ = fVar150;
  auVar90._24_4_ = fVar150;
  auVar90._28_4_ = fVar150;
  auVar100 = vcvtdq2ps_avx(auVar104);
  auVar103 = vcvtdq2ps_avx(auVar105);
  auVar103 = vsubps_avx(auVar103,auVar100);
  auVar7 = vfmadd213ps_fma(auVar103,auVar90,auVar100);
  auVar100 = vcvtdq2ps_avx(auVar106);
  auVar103 = vcvtdq2ps_avx(auVar107);
  auVar103 = vsubps_avx(auVar103,auVar100);
  auVar8 = vfmadd213ps_fma(auVar103,auVar90,auVar100);
  auVar100 = vcvtdq2ps_avx(auVar108);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x16 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar100);
  auVar9 = vfmadd213ps_fma(auVar103,auVar90,auVar100);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x14 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x18 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar100);
  auVar10 = vfmadd213ps_fma(auVar103,auVar90,auVar100);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x1d + 6));
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x21 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar100);
  auVar11 = vfmadd213ps_fma(auVar103,auVar90,auVar100);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x1f + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x23 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar100);
  auVar82 = vfmadd213ps_fma(auVar103,auVar90,auVar100);
  auVar100 = vsubps_avx(ZEXT1632(auVar7),auVar101);
  auVar92._4_4_ = auVar80._4_4_ * auVar100._4_4_;
  auVar92._0_4_ = auVar80._0_4_ * auVar100._0_4_;
  auVar92._8_4_ = auVar80._8_4_ * auVar100._8_4_;
  auVar92._12_4_ = auVar80._12_4_ * auVar100._12_4_;
  auVar92._16_4_ = auVar100._16_4_ * 0.0;
  auVar92._20_4_ = auVar100._20_4_ * 0.0;
  auVar92._24_4_ = auVar100._24_4_ * 0.0;
  auVar92._28_4_ = auVar100._28_4_;
  auVar100 = vsubps_avx(ZEXT1632(auVar8),auVar101);
  auVar107._0_4_ = auVar80._0_4_ * auVar100._0_4_;
  auVar107._4_4_ = auVar80._4_4_ * auVar100._4_4_;
  auVar107._8_4_ = auVar80._8_4_ * auVar100._8_4_;
  auVar107._12_4_ = auVar80._12_4_ * auVar100._12_4_;
  auVar107._16_4_ = auVar100._16_4_ * 0.0;
  auVar107._20_4_ = auVar100._20_4_ * 0.0;
  auVar107._24_4_ = auVar100._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar100 = vsubps_avx(ZEXT1632(auVar9),auVar87);
  auVar93._4_4_ = auVar79._4_4_ * auVar100._4_4_;
  auVar93._0_4_ = auVar79._0_4_ * auVar100._0_4_;
  auVar93._8_4_ = auVar79._8_4_ * auVar100._8_4_;
  auVar93._12_4_ = auVar79._12_4_ * auVar100._12_4_;
  auVar93._16_4_ = auVar100._16_4_ * 0.0;
  auVar93._20_4_ = auVar100._20_4_ * 0.0;
  auVar93._24_4_ = auVar100._24_4_ * 0.0;
  auVar93._28_4_ = auVar100._28_4_;
  auVar100 = vsubps_avx(ZEXT1632(auVar10),auVar87);
  auVar106._0_4_ = auVar79._0_4_ * auVar100._0_4_;
  auVar106._4_4_ = auVar79._4_4_ * auVar100._4_4_;
  auVar106._8_4_ = auVar79._8_4_ * auVar100._8_4_;
  auVar106._12_4_ = auVar79._12_4_ * auVar100._12_4_;
  auVar106._16_4_ = auVar100._16_4_ * 0.0;
  auVar106._20_4_ = auVar100._20_4_ * 0.0;
  auVar106._24_4_ = auVar100._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar100 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar83));
  auVar104._4_4_ = auVar81._4_4_ * auVar100._4_4_;
  auVar104._0_4_ = auVar81._0_4_ * auVar100._0_4_;
  auVar104._8_4_ = auVar81._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar81._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = auVar100._28_4_;
  auVar100 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar83));
  auVar105._0_4_ = auVar81._0_4_ * auVar100._0_4_;
  auVar105._4_4_ = auVar81._4_4_ * auVar100._4_4_;
  auVar105._8_4_ = auVar81._8_4_ * auVar100._8_4_;
  auVar105._12_4_ = auVar81._12_4_ * auVar100._12_4_;
  auVar105._16_4_ = auVar100._16_4_ * 0.0;
  auVar105._20_4_ = auVar100._20_4_ * 0.0;
  auVar105._24_4_ = auVar100._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar92,auVar107);
  auVar103 = vpminsd_avx2(auVar93,auVar106);
  auVar100 = vmaxps_avx(auVar100,auVar103);
  auVar103 = vpminsd_avx2(auVar104,auVar105);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar102._4_4_ = uVar138;
  auVar102._0_4_ = uVar138;
  auVar102._8_4_ = uVar138;
  auVar102._12_4_ = uVar138;
  auVar102._16_4_ = uVar138;
  auVar102._20_4_ = uVar138;
  auVar102._24_4_ = uVar138;
  auVar102._28_4_ = uVar138;
  auVar103 = vmaxps_avx512vl(auVar103,auVar102);
  auVar100 = vmaxps_avx(auVar100,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar100,auVar103);
  auVar100 = vpmaxsd_avx2(auVar92,auVar107);
  auVar103 = vpmaxsd_avx2(auVar93,auVar106);
  auVar100 = vminps_avx(auVar100,auVar103);
  auVar103 = vpmaxsd_avx2(auVar104,auVar105);
  uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar101._4_4_ = uVar138;
  auVar101._0_4_ = uVar138;
  auVar101._8_4_ = uVar138;
  auVar101._12_4_ = uVar138;
  auVar101._16_4_ = uVar138;
  auVar101._20_4_ = uVar138;
  auVar101._24_4_ = uVar138;
  auVar101._28_4_ = uVar138;
  auVar103 = vminps_avx512vl(auVar103,auVar101);
  auVar100 = vminps_avx(auVar100,auVar103);
  auVar97._8_4_ = 0x3f800003;
  auVar97._0_8_ = 0x3f8000033f800003;
  auVar97._12_4_ = 0x3f800003;
  auVar97._16_4_ = 0x3f800003;
  auVar97._20_4_ = 0x3f800003;
  auVar97._24_4_ = 0x3f800003;
  auVar97._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar97);
  auVar103 = vpbroadcastd_avx512vl();
  uVar144 = vcmpps_avx512vl(local_80,auVar100,2);
  uVar22 = vpcmpgtd_avx512vl(auVar103,_DAT_01fb4ba0);
  uVar72 = (ulong)(byte)((byte)uVar144 & (byte)uVar22);
  local_450 = pre->ray_space + k;
  local_3b0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5e0 = pre;
  local_5b8 = context;
  local_448 = prim;
  for (; pRVar65 = local_5b8, uVar72 != 0;
      uVar72 = (ulong)((uint)uVar72 & (uint)uVar72 + 0xff & (uint)uVar144)) {
    lVar67 = 0;
    for (uVar76 = uVar72; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      lVar67 = lVar67 + 1;
    }
    local_5d8 = (ulong)*(uint *)(local_448 + 2);
    pGVar71 = (context->scene->geometries).items[local_5d8].ptr;
    uVar76 = (ulong)*(uint *)(*(long *)&pGVar71->field_0x58 +
                             (ulong)*(uint *)(local_448 + lVar67 * 4 + 6) *
                             pGVar71[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar150 = (pGVar71->time_range).lower;
    fVar150 = pGVar71->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar150) / ((pGVar71->time_range).upper - fVar150))
    ;
    auVar80 = vroundss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),9);
    auVar80 = vminss_avx(auVar80,ZEXT416((uint)(pGVar71->fnumTimeSegments + -1.0)));
    auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,auVar80);
    fVar150 = fVar150 - auVar80._0_4_;
    _Var13 = pGVar71[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar68 = (long)(int)auVar80._0_4_ * 0x38;
    lVar67 = *(long *)(_Var13 + 0x10 + lVar68);
    lVar73 = *(long *)(_Var13 + 0x38 + lVar68);
    lVar14 = *(long *)(_Var13 + 0x48 + lVar68);
    auVar145._4_4_ = fVar150;
    auVar145._0_4_ = fVar150;
    auVar145._8_4_ = fVar150;
    auVar145._12_4_ = fVar150;
    pfVar4 = (float *)(lVar73 + uVar76 * lVar14);
    auVar174._0_4_ = fVar150 * *pfVar4;
    auVar174._4_4_ = fVar150 * pfVar4[1];
    auVar174._8_4_ = fVar150 * pfVar4[2];
    auVar174._12_4_ = fVar150 * pfVar4[3];
    pfVar4 = (float *)(lVar73 + (uVar76 + 1) * lVar14);
    auVar175._0_4_ = fVar150 * *pfVar4;
    auVar175._4_4_ = fVar150 * pfVar4[1];
    auVar175._8_4_ = fVar150 * pfVar4[2];
    auVar175._12_4_ = fVar150 * pfVar4[3];
    auVar80 = vmulps_avx512vl(auVar145,*(undefined1 (*) [16])(lVar73 + (uVar76 + 2) * lVar14));
    auVar79 = vmulps_avx512vl(auVar145,*(undefined1 (*) [16])(lVar73 + lVar14 * (uVar76 + 3)));
    lVar73 = *(long *)(_Var13 + lVar68);
    fVar150 = 1.0 - fVar150;
    auVar139._4_4_ = fVar150;
    auVar139._0_4_ = fVar150;
    auVar139._8_4_ = fVar150;
    auVar139._12_4_ = fVar150;
    local_4f0 = vfmadd231ps_fma(auVar174,auVar139,*(undefined1 (*) [16])(lVar73 + lVar67 * uVar76));
    local_500 = vfmadd231ps_fma(auVar175,auVar139,
                                *(undefined1 (*) [16])(lVar73 + lVar67 * (uVar76 + 1)));
    local_510 = vfmadd231ps_avx512vl
                          (auVar80,auVar139,*(undefined1 (*) [16])(lVar73 + lVar67 * (uVar76 + 2)));
    _local_390 = vfmadd231ps_avx512vl
                           (auVar79,auVar139,*(undefined1 (*) [16])(lVar73 + lVar67 * (uVar76 + 3)))
    ;
    iVar12 = (int)pGVar71[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar81 = vsubps_avx(local_4f0,auVar80);
    uVar138 = auVar81._0_4_;
    auVar84._4_4_ = uVar138;
    auVar84._0_4_ = uVar138;
    auVar84._8_4_ = uVar138;
    auVar84._12_4_ = uVar138;
    auVar79 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    aVar5 = (local_450->vx).field_0;
    aVar6 = (local_450->vy).field_0;
    fVar150 = (local_450->vz).field_0.m128[0];
    fVar165 = *(float *)((long)&(local_450->vz).field_0 + 4);
    fVar168 = *(float *)((long)&(local_450->vz).field_0 + 8);
    fVar169 = *(float *)((long)&(local_450->vz).field_0 + 0xc);
    auVar167._0_4_ = fVar150 * auVar81._0_4_;
    auVar167._4_4_ = fVar165 * auVar81._4_4_;
    auVar167._8_4_ = fVar168 * auVar81._8_4_;
    auVar167._12_4_ = fVar169 * auVar81._12_4_;
    auVar79 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar6,auVar79);
    auVar7 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar84);
    auVar81 = vsubps_avx(local_500,auVar80);
    uVar138 = auVar81._0_4_;
    auVar148._4_4_ = uVar138;
    auVar148._0_4_ = uVar138;
    auVar148._8_4_ = uVar138;
    auVar148._12_4_ = uVar138;
    auVar79 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar170._0_4_ = fVar150 * auVar81._0_4_;
    auVar170._4_4_ = fVar165 * auVar81._4_4_;
    auVar170._8_4_ = fVar168 * auVar81._8_4_;
    auVar170._12_4_ = fVar169 * auVar81._12_4_;
    auVar79 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar6,auVar79);
    auVar8 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar148);
    auVar81 = vsubps_avx512vl(local_510,auVar80);
    uVar138 = auVar81._0_4_;
    auVar149._4_4_ = uVar138;
    auVar149._0_4_ = uVar138;
    auVar149._8_4_ = uVar138;
    auVar149._12_4_ = uVar138;
    auVar79 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar173._0_4_ = fVar150 * auVar81._0_4_;
    auVar173._4_4_ = fVar165 * auVar81._4_4_;
    auVar173._8_4_ = fVar168 * auVar81._8_4_;
    auVar173._12_4_ = fVar169 * auVar81._12_4_;
    auVar79 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar6,auVar79);
    auVar81 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar149);
    auVar79 = vsubps_avx512vl(_local_390,auVar80);
    uVar138 = auVar79._0_4_;
    auVar146._4_4_ = uVar138;
    auVar146._0_4_ = uVar138;
    auVar146._8_4_ = uVar138;
    auVar146._12_4_ = uVar138;
    auVar80 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar176._0_4_ = fVar150 * auVar79._0_4_;
    auVar176._4_4_ = fVar165 * auVar79._4_4_;
    auVar176._8_4_ = fVar168 * auVar79._8_4_;
    auVar176._12_4_ = fVar169 * auVar79._12_4_;
    auVar80 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar6,auVar80);
    auVar9 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar146);
    lVar67 = (long)iVar12 * 0x44;
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar67);
    local_3e0 = vbroadcastss_avx512vl(auVar7);
    auVar108._8_4_ = 1;
    auVar108._0_8_ = 0x100000001;
    auVar108._12_4_ = 1;
    auVar108._16_4_ = 1;
    auVar108._20_4_ = 1;
    auVar108._24_4_ = 1;
    auVar108._28_4_ = 1;
    local_400 = vpermps_avx2(auVar108,ZEXT1632(auVar7));
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x484);
    uVar138 = auVar8._0_4_;
    local_420._4_4_ = uVar138;
    local_420._0_4_ = uVar138;
    local_420._8_4_ = uVar138;
    local_420._12_4_ = uVar138;
    local_420._16_4_ = uVar138;
    local_420._20_4_ = uVar138;
    local_420._24_4_ = uVar138;
    local_420._28_4_ = uVar138;
    local_560 = vpermps_avx2(auVar108,ZEXT1632(auVar8));
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x908);
    local_580 = vbroadcastss_avx512vl(auVar81);
    local_4e0 = vpermps_avx512vl(auVar108,ZEXT1632(auVar81));
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0xd8c);
    local_4a0 = vbroadcastss_avx512vl(auVar9);
    auVar187 = ZEXT3264(local_4a0);
    local_4c0 = vpermps_avx512vl(auVar108,ZEXT1632(auVar9));
    auVar188 = ZEXT3264(local_4c0);
    auVar97 = vmulps_avx512vl(local_4a0,auVar101);
    auVar98 = vmulps_avx512vl(local_4c0,auVar101);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_580);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_4e0);
    auVar80 = vfmadd231ps_fma(auVar97,auVar103,local_420);
    auVar79 = vfmadd231ps_fma(auVar98,auVar103,local_560);
    auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar100,local_3e0);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar100,local_400);
    auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar67);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x484);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x908);
    auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0xd8c);
    auVar105 = vmulps_avx512vl(local_4a0,auVar92);
    auVar106 = vmulps_avx512vl(local_4c0,auVar92);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar99,local_580);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,local_4e0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar98,local_420);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,local_560);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,local_3e0);
    auVar10 = vfmadd231ps_fma(auVar106,auVar97,local_400);
    auVar106 = vsubps_avx512vl(auVar105,auVar93);
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar10),auVar104);
    auVar108 = vmulps_avx512vl(auVar104,auVar106);
    auVar87 = vmulps_avx512vl(auVar93,auVar107);
    auVar108 = vsubps_avx512vl(auVar108,auVar87);
    auVar80 = vshufps_avx(local_4f0,local_4f0,0xff);
    uVar144 = auVar80._0_8_;
    local_a0._8_8_ = uVar144;
    local_a0._0_8_ = uVar144;
    local_a0._16_8_ = uVar144;
    local_a0._24_8_ = uVar144;
    auVar80 = vshufps_avx(local_500,local_500,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar80);
    auVar80 = vshufps_avx512vl(local_510,local_510,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar80);
    auVar80 = vshufps_avx512vl(_local_390,_local_390,0xff);
    uVar144 = auVar80._0_8_;
    register0x000012c8 = uVar144;
    local_100 = uVar144;
    register0x000012d0 = uVar144;
    register0x000012d8 = uVar144;
    auVar87 = vmulps_avx512vl(_local_100,auVar101);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_e0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar103,local_c0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,local_a0);
    auVar88 = vmulps_avx512vl(_local_100,auVar92);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar99,local_e0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar98,local_c0);
    auVar11 = vfmadd231ps_fma(auVar88,auVar97,local_a0);
    auVar88 = vmulps_avx512vl(auVar107,auVar107);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar106,auVar106);
    auVar89 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar11));
    auVar89 = vmulps_avx512vl(auVar89,auVar89);
    auVar88 = vmulps_avx512vl(auVar89,auVar88);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    uVar144 = vcmpps_avx512vl(auVar108,auVar88,2);
    auVar80 = vblendps_avx(auVar7,local_4f0,8);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar79 = vandps_avx512vl(auVar80,auVar82);
    auVar80 = vblendps_avx(auVar8,local_500,8);
    auVar80 = vandps_avx512vl(auVar80,auVar82);
    auVar79 = vmaxps_avx(auVar79,auVar80);
    auVar80 = vblendps_avx(auVar81,local_510,8);
    auVar83 = vandps_avx512vl(auVar80,auVar82);
    auVar80 = vblendps_avx(auVar9,_local_390,8);
    auVar80 = vandps_avx512vl(auVar80,auVar82);
    auVar80 = vmaxps_avx(auVar83,auVar80);
    auVar80 = vmaxps_avx(auVar79,auVar80);
    auVar79 = vmovshdup_avx(auVar80);
    auVar79 = vmaxss_avx(auVar79,auVar80);
    auVar80 = vshufpd_avx(auVar80,auVar80,1);
    local_520 = vcvtsi2ss_avx512f(local_510,iVar12);
    auVar80 = vmaxss_avx(auVar80,auVar79);
    fVar150 = local_520._0_4_;
    auVar96._4_4_ = fVar150;
    auVar96._0_4_ = fVar150;
    auVar96._8_4_ = fVar150;
    auVar96._12_4_ = fVar150;
    auVar96._16_4_ = fVar150;
    auVar96._20_4_ = fVar150;
    auVar96._24_4_ = fVar150;
    auVar96._28_4_ = fVar150;
    uVar22 = vcmpps_avx512vl(auVar96,_DAT_01f7b060,0xe);
    bVar74 = (byte)uVar144 & (byte)uVar22;
    local_340 = auVar80._0_4_ * 4.7683716e-07;
    auVar95._8_4_ = 2;
    auVar95._0_8_ = 0x200000002;
    auVar95._12_4_ = 2;
    auVar95._16_4_ = 2;
    auVar95._20_4_ = 2;
    auVar95._24_4_ = 2;
    auVar95._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar95,ZEXT1632(auVar7));
    local_140 = vpermps_avx512vl(auVar95,ZEXT1632(auVar8));
    local_160 = vpermps_avx512vl(auVar95,ZEXT1632(auVar81));
    local_480 = vpermps_avx2(auVar95,ZEXT1632(auVar9));
    local_3a0 = vpbroadcastd_avx512vl();
    uVar166 = *(uint *)(ray + k * 4 + 0x30);
    auVar80 = ZEXT416((uint)local_340);
    if (bVar74 == 0) {
      bVar69 = false;
      auVar80 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
      auVar182 = ZEXT1664(auVar80);
      auVar183 = ZEXT3264(local_3e0);
      auVar184 = ZEXT3264(local_400);
      auVar185 = ZEXT3264(local_420);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar189 = ZEXT3264(auVar100);
      auVar181 = ZEXT3264(local_560);
      auVar180 = ZEXT3264(local_580);
      auVar186 = ZEXT3264(local_4e0);
    }
    else {
      local_440._0_16_ = ZEXT416(uVar166);
      auVar92 = vmulps_avx512vl(local_480,auVar92);
      auVar99 = vfmadd213ps_avx512vl(auVar99,local_160,auVar92);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar99);
      auVar98 = vfmadd213ps_avx512vl(auVar97,local_120,auVar98);
      auVar101 = vmulps_avx512vl(local_480,auVar101);
      auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar101);
      auVar99 = vfmadd213ps_avx512vl(auVar103,local_140,auVar102);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1210);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1694);
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1f9c);
      auVar99 = vfmadd213ps_avx512vl(auVar100,local_120,auVar99);
      auVar100 = vmulps_avx512vl(local_4a0,auVar97);
      auVar92 = vmulps_avx512vl(local_4c0,auVar97);
      auVar97 = vmulps_avx512vl(local_480,auVar97);
      auVar79 = vfmadd231ps_fma(auVar100,auVar101,local_580);
      auVar100 = vfmadd231ps_avx512vl(auVar92,auVar101,local_4e0);
      auVar101 = vfmadd231ps_avx512vl(auVar97,local_160,auVar101);
      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar102,local_420);
      auVar181 = ZEXT3264(local_560);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_560);
      auVar97 = vfmadd231ps_avx512vl(auVar101,local_140,auVar102);
      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar103,local_3e0);
      auVar92 = vfmadd231ps_avx512vl(auVar100,auVar103,local_400);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1210);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1b18);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1f9c);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_120,auVar103);
      auVar103 = vmulps_avx512vl(local_4a0,auVar101);
      auVar108 = vmulps_avx512vl(local_4c0,auVar101);
      auVar101 = vmulps_avx512vl(local_480,auVar101);
      auVar88 = vfmadd231ps_avx512vl(auVar103,auVar102,local_580);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,local_4e0);
      auVar102 = vfmadd231ps_avx512vl(auVar101,local_160,auVar102);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1694);
      auVar101 = vfmadd231ps_avx512vl(auVar88,auVar103,local_420);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_560);
      auVar103 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
      auVar81 = vfmadd231ps_fma(auVar101,auVar100,local_3e0);
      auVar102 = vfmadd231ps_avx512vl(auVar108,auVar100,local_400);
      auVar101 = vfmadd231ps_avx512vl(auVar103,local_120,auVar100);
      auVar178._8_4_ = 0x7fffffff;
      auVar178._0_8_ = 0x7fffffff7fffffff;
      auVar178._12_4_ = 0x7fffffff;
      auVar178._16_4_ = 0x7fffffff;
      auVar178._20_4_ = 0x7fffffff;
      auVar178._24_4_ = 0x7fffffff;
      auVar178._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(ZEXT1632(auVar79),auVar178);
      auVar103 = vandps_avx(auVar92,auVar178);
      auVar103 = vmaxps_avx(auVar100,auVar103);
      auVar100 = vandps_avx(auVar97,auVar178);
      auVar100 = vmaxps_avx(auVar103,auVar100);
      auVar97 = vbroadcastss_avx512vl(auVar80);
      uVar76 = vcmpps_avx512vl(auVar100,auVar97,1);
      bVar69 = (bool)((byte)uVar76 & 1);
      auVar109._0_4_ = (float)((uint)bVar69 * auVar106._0_4_ | (uint)!bVar69 * auVar79._0_4_);
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar69 * auVar106._4_4_ | (uint)!bVar69 * auVar79._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar69 * auVar106._8_4_ | (uint)!bVar69 * auVar79._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar69 * auVar106._12_4_ | (uint)!bVar69 * auVar79._12_4_);
      fVar169 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar106._16_4_);
      auVar109._16_4_ = fVar169;
      fVar165 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar106._20_4_);
      auVar109._20_4_ = fVar165;
      fVar168 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar106._24_4_);
      auVar109._24_4_ = fVar168;
      uVar1 = (uint)(byte)(uVar76 >> 7) * auVar106._28_4_;
      auVar109._28_4_ = uVar1;
      bVar69 = (bool)((byte)uVar76 & 1);
      auVar110._0_4_ = (float)((uint)bVar69 * auVar107._0_4_ | (uint)!bVar69 * auVar92._0_4_);
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * auVar92._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * auVar92._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * auVar92._12_4_);
      bVar69 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * auVar92._16_4_);
      bVar69 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * auVar92._20_4_);
      bVar69 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * auVar92._24_4_);
      bVar69 = SUB81(uVar76 >> 7,0);
      auVar110._28_4_ = (uint)bVar69 * auVar107._28_4_ | (uint)!bVar69 * auVar92._28_4_;
      auVar100 = vandps_avx(auVar178,ZEXT1632(auVar81));
      auVar103 = vandps_avx(auVar102,auVar178);
      auVar103 = vmaxps_avx(auVar100,auVar103);
      auVar100 = vandps_avx(auVar101,auVar178);
      auVar100 = vmaxps_avx(auVar103,auVar100);
      uVar76 = vcmpps_avx512vl(auVar100,auVar97,1);
      bVar69 = (bool)((byte)uVar76 & 1);
      auVar111._0_4_ = (float)((uint)bVar69 * auVar106._0_4_ | (uint)!bVar69 * auVar81._0_4_);
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar69 * auVar106._4_4_ | (uint)!bVar69 * auVar81._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar69 * auVar106._8_4_ | (uint)!bVar69 * auVar81._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar69 * auVar106._12_4_ | (uint)!bVar69 * auVar81._12_4_);
      fVar163 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar106._16_4_);
      auVar111._16_4_ = fVar163;
      fVar161 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar106._20_4_);
      auVar111._20_4_ = fVar161;
      fVar162 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar106._24_4_);
      auVar111._24_4_ = fVar162;
      auVar111._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar106._28_4_;
      bVar69 = (bool)((byte)uVar76 & 1);
      auVar112._0_4_ = (float)((uint)bVar69 * auVar107._0_4_ | (uint)!bVar69 * auVar102._0_4_);
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * auVar102._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * auVar102._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * auVar102._12_4_);
      bVar69 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * auVar102._16_4_);
      bVar69 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * auVar102._20_4_);
      bVar69 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * auVar102._24_4_);
      bVar69 = SUB81(uVar76 >> 7,0);
      auVar112._28_4_ = (uint)bVar69 * auVar107._28_4_ | (uint)!bVar69 * auVar102._28_4_;
      auVar84 = vxorps_avx512vl(local_580._0_16_,local_580._0_16_);
      auVar182 = ZEXT1664(auVar84);
      auVar100 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar84));
      auVar79 = vfmadd231ps_fma(auVar100,auVar110,auVar110);
      auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar77 = auVar100._0_4_;
      fVar78 = auVar100._4_4_;
      fVar130 = auVar100._8_4_;
      fVar131 = auVar100._12_4_;
      fVar132 = auVar100._16_4_;
      fVar133 = auVar100._20_4_;
      fVar134 = auVar100._24_4_;
      auVar29._4_4_ = fVar78 * fVar78 * fVar78 * auVar79._4_4_ * -0.5;
      auVar29._0_4_ = fVar77 * fVar77 * fVar77 * auVar79._0_4_ * -0.5;
      auVar29._8_4_ = fVar130 * fVar130 * fVar130 * auVar79._8_4_ * -0.5;
      auVar29._12_4_ = fVar131 * fVar131 * fVar131 * auVar79._12_4_ * -0.5;
      auVar29._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar29._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar29._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar29._28_4_ = 0;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar102 = vfmadd231ps_avx512vl(auVar29,auVar103,auVar100);
      auVar30._4_4_ = auVar110._4_4_ * auVar102._4_4_;
      auVar30._0_4_ = auVar110._0_4_ * auVar102._0_4_;
      auVar30._8_4_ = auVar110._8_4_ * auVar102._8_4_;
      auVar30._12_4_ = auVar110._12_4_ * auVar102._12_4_;
      auVar30._16_4_ = auVar110._16_4_ * auVar102._16_4_;
      auVar30._20_4_ = auVar110._20_4_ * auVar102._20_4_;
      auVar30._24_4_ = auVar110._24_4_ * auVar102._24_4_;
      auVar30._28_4_ = auVar100._28_4_;
      auVar31._4_4_ = auVar102._4_4_ * -auVar109._4_4_;
      auVar31._0_4_ = auVar102._0_4_ * -auVar109._0_4_;
      auVar31._8_4_ = auVar102._8_4_ * -auVar109._8_4_;
      auVar31._12_4_ = auVar102._12_4_ * -auVar109._12_4_;
      auVar31._16_4_ = auVar102._16_4_ * -fVar169;
      auVar31._20_4_ = auVar102._20_4_ * -fVar165;
      auVar31._24_4_ = auVar102._24_4_ * -fVar168;
      auVar31._28_4_ = uVar1 ^ 0x80000000;
      auVar100 = vmulps_avx512vl(auVar102,ZEXT1632(auVar84));
      auVar106 = ZEXT1632(auVar84);
      auVar101 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar106);
      auVar79 = vfmadd231ps_fma(auVar101,auVar112,auVar112);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar165 = auVar101._0_4_;
      fVar168 = auVar101._4_4_;
      fVar169 = auVar101._8_4_;
      fVar77 = auVar101._12_4_;
      fVar78 = auVar101._16_4_;
      fVar130 = auVar101._20_4_;
      fVar131 = auVar101._24_4_;
      auVar32._4_4_ = fVar168 * fVar168 * fVar168 * auVar79._4_4_ * -0.5;
      auVar32._0_4_ = fVar165 * fVar165 * fVar165 * auVar79._0_4_ * -0.5;
      auVar32._8_4_ = fVar169 * fVar169 * fVar169 * auVar79._8_4_ * -0.5;
      auVar32._12_4_ = fVar77 * fVar77 * fVar77 * auVar79._12_4_ * -0.5;
      auVar32._16_4_ = fVar78 * fVar78 * fVar78 * -0.0;
      auVar32._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar32._24_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar32._28_4_ = 0;
      auVar103 = vfmadd231ps_avx512vl(auVar32,auVar103,auVar101);
      auVar33._4_4_ = auVar112._4_4_ * auVar103._4_4_;
      auVar33._0_4_ = auVar112._0_4_ * auVar103._0_4_;
      auVar33._8_4_ = auVar112._8_4_ * auVar103._8_4_;
      auVar33._12_4_ = auVar112._12_4_ * auVar103._12_4_;
      auVar33._16_4_ = auVar112._16_4_ * auVar103._16_4_;
      auVar33._20_4_ = auVar112._20_4_ * auVar103._20_4_;
      auVar33._24_4_ = auVar112._24_4_ * auVar103._24_4_;
      auVar33._28_4_ = auVar101._28_4_;
      auVar34._4_4_ = -auVar111._4_4_ * auVar103._4_4_;
      auVar34._0_4_ = -auVar111._0_4_ * auVar103._0_4_;
      auVar34._8_4_ = -auVar111._8_4_ * auVar103._8_4_;
      auVar34._12_4_ = -auVar111._12_4_ * auVar103._12_4_;
      auVar34._16_4_ = -fVar163 * auVar103._16_4_;
      auVar34._20_4_ = -fVar161 * auVar103._20_4_;
      auVar34._24_4_ = -fVar162 * auVar103._24_4_;
      auVar34._28_4_ = auVar102._28_4_;
      auVar103 = vmulps_avx512vl(auVar103,auVar106);
      auVar79 = vfmadd213ps_fma(auVar30,auVar87,auVar93);
      auVar81 = vfmadd213ps_fma(auVar31,auVar87,auVar104);
      auVar102 = vfmadd213ps_avx512vl(auVar100,auVar87,auVar99);
      auVar101 = vfmadd213ps_avx512vl(auVar33,ZEXT1632(auVar11),auVar105);
      auVar82 = vfnmadd213ps_fma(auVar30,auVar87,auVar93);
      auVar92 = ZEXT1632(auVar11);
      auVar7 = vfmadd213ps_fma(auVar34,auVar92,ZEXT1632(auVar10));
      auVar83 = vfnmadd213ps_fma(auVar31,auVar87,auVar104);
      auVar8 = vfmadd213ps_fma(auVar103,auVar92,auVar98);
      auVar97 = vfnmadd231ps_avx512vl(auVar99,auVar87,auVar100);
      auVar139 = vfnmadd213ps_fma(auVar33,auVar92,auVar105);
      auVar145 = vfnmadd213ps_fma(auVar34,auVar92,ZEXT1632(auVar10));
      auVar146 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar11),auVar103);
      auVar103 = vsubps_avx512vl(auVar101,ZEXT1632(auVar82));
      auVar100 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar83));
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar8),auVar97);
      auVar99 = vmulps_avx512vl(auVar100,auVar97);
      auVar9 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar83),auVar98);
      auVar35._4_4_ = auVar82._4_4_ * auVar98._4_4_;
      auVar35._0_4_ = auVar82._0_4_ * auVar98._0_4_;
      auVar35._8_4_ = auVar82._8_4_ * auVar98._8_4_;
      auVar35._12_4_ = auVar82._12_4_ * auVar98._12_4_;
      auVar35._16_4_ = auVar98._16_4_ * 0.0;
      auVar35._20_4_ = auVar98._20_4_ * 0.0;
      auVar35._24_4_ = auVar98._24_4_ * 0.0;
      auVar35._28_4_ = auVar98._28_4_;
      auVar98 = vfmsub231ps_avx512vl(auVar35,auVar97,auVar103);
      auVar36._4_4_ = auVar83._4_4_ * auVar103._4_4_;
      auVar36._0_4_ = auVar83._0_4_ * auVar103._0_4_;
      auVar36._8_4_ = auVar83._8_4_ * auVar103._8_4_;
      auVar36._12_4_ = auVar83._12_4_ * auVar103._12_4_;
      auVar36._16_4_ = auVar103._16_4_ * 0.0;
      auVar36._20_4_ = auVar103._20_4_ * 0.0;
      auVar36._24_4_ = auVar103._24_4_ * 0.0;
      auVar36._28_4_ = auVar103._28_4_;
      auVar10 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar82),auVar100);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar106,auVar98);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar9));
      auVar106 = ZEXT1632(auVar84);
      uVar76 = vcmpps_avx512vl(auVar100,auVar106,2);
      bVar66 = (byte)uVar76;
      fVar77 = (float)((uint)(bVar66 & 1) * auVar79._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar139._0_4_);
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      fVar130 = (float)((uint)bVar69 * auVar79._4_4_ | (uint)!bVar69 * auVar139._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      fVar132 = (float)((uint)bVar69 * auVar79._8_4_ | (uint)!bVar69 * auVar139._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      fVar134 = (float)((uint)bVar69 * auVar79._12_4_ | (uint)!bVar69 * auVar139._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar77))));
      fVar78 = (float)((uint)(bVar66 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar145._0_4_);
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      fVar131 = (float)((uint)bVar69 * auVar81._4_4_ | (uint)!bVar69 * auVar145._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      fVar133 = (float)((uint)bVar69 * auVar81._8_4_ | (uint)!bVar69 * auVar145._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      fVar135 = (float)((uint)bVar69 * auVar81._12_4_ | (uint)!bVar69 * auVar145._12_4_);
      auVar92 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar78))));
      auVar113._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar146._0_4_)
      ;
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar69 * auVar102._4_4_ | (uint)!bVar69 * auVar146._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar69 * auVar102._8_4_ | (uint)!bVar69 * auVar146._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar69 * auVar102._12_4_ | (uint)!bVar69 * auVar146._12_4_);
      fVar165 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar102._16_4_);
      auVar113._16_4_ = fVar165;
      fVar169 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar102._20_4_);
      auVar113._20_4_ = fVar169;
      fVar168 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar102._24_4_);
      auVar113._24_4_ = fVar168;
      iVar2 = (uint)(byte)(uVar76 >> 7) * auVar102._28_4_;
      auVar113._28_4_ = iVar2;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar101);
      auVar114._0_4_ =
           (uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar81._0_4_;
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar69 * auVar103._4_4_ | (uint)!bVar69 * auVar81._4_4_;
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar69 * auVar103._8_4_ | (uint)!bVar69 * auVar81._8_4_;
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar69 * auVar103._12_4_ | (uint)!bVar69 * auVar81._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar103._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar103._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar103._24_4_;
      auVar114._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar7));
      auVar115._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar9._0_4_);
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar69 * auVar103._4_4_ | (uint)!bVar69 * auVar9._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar69 * auVar103._8_4_ | (uint)!bVar69 * auVar9._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar69 * auVar103._12_4_ | (uint)!bVar69 * auVar9._12_4_);
      fVar162 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar103._16_4_);
      auVar115._16_4_ = fVar162;
      fVar161 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar103._20_4_);
      auVar115._20_4_ = fVar161;
      fVar163 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar103._24_4_);
      auVar115._24_4_ = fVar163;
      auVar115._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar103._28_4_;
      auVar103 = vblendmps_avx512vl(auVar97,ZEXT1632(auVar8));
      auVar116._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar102._0_4_)
      ;
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar69 * auVar103._4_4_ | (uint)!bVar69 * auVar102._4_4_);
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar69 * auVar103._8_4_ | (uint)!bVar69 * auVar102._8_4_);
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar69 * auVar103._12_4_ | (uint)!bVar69 * auVar102._12_4_);
      bVar69 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar69 * auVar103._16_4_ | (uint)!bVar69 * auVar102._16_4_);
      bVar69 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar69 * auVar103._20_4_ | (uint)!bVar69 * auVar102._20_4_);
      bVar69 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar69 * auVar103._24_4_ | (uint)!bVar69 * auVar102._24_4_);
      bVar69 = SUB81(uVar76 >> 7,0);
      auVar116._28_4_ = (uint)bVar69 * auVar103._28_4_ | (uint)!bVar69 * auVar102._28_4_;
      auVar117._0_4_ =
           (uint)(bVar66 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar101._0_4_;
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar69 * (int)auVar82._4_4_ | (uint)!bVar69 * auVar101._4_4_;
      bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar69 * (int)auVar82._8_4_ | (uint)!bVar69 * auVar101._8_4_;
      bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar69 * (int)auVar82._12_4_ | (uint)!bVar69 * auVar101._12_4_;
      auVar117._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar101._16_4_;
      auVar117._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar101._20_4_;
      auVar117._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar101._24_4_;
      auVar117._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar101._28_4_;
      bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar118._0_4_ = (uint)(bVar66 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar8._0_4_
      ;
      bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar8._4_4_;
      bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar8._8_4_;
      bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar8._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar97._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar97._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar97._24_4_;
      iVar3 = (uint)(byte)(uVar76 >> 7) * auVar97._28_4_;
      auVar118._28_4_ = iVar3;
      auVar93 = vsubps_avx512vl(auVar117,auVar99);
      auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar83._12_4_ |
                                               (uint)!bVar19 * auVar7._12_4_,
                                               CONCAT48((uint)bVar17 * (int)auVar83._8_4_ |
                                                        (uint)!bVar17 * auVar7._8_4_,
                                                        CONCAT44((uint)bVar69 * (int)auVar83._4_4_ |
                                                                 (uint)!bVar69 * auVar7._4_4_,
                                                                 (uint)(bVar66 & 1) *
                                                                 (int)auVar83._0_4_ |
                                                                 (uint)!(bool)(bVar66 & 1) *
                                                                 auVar7._0_4_)))),auVar92);
      auVar102 = vsubps_avx(auVar118,auVar113);
      auVar101 = vsubps_avx(auVar99,auVar114);
      auVar97 = vsubps_avx(auVar92,auVar115);
      auVar98 = vsubps_avx(auVar113,auVar116);
      auVar37._4_4_ = auVar102._4_4_ * fVar130;
      auVar37._0_4_ = auVar102._0_4_ * fVar77;
      auVar37._8_4_ = auVar102._8_4_ * fVar132;
      auVar37._12_4_ = auVar102._12_4_ * fVar134;
      auVar37._16_4_ = auVar102._16_4_ * 0.0;
      auVar37._20_4_ = auVar102._20_4_ * 0.0;
      auVar37._24_4_ = auVar102._24_4_ * 0.0;
      auVar37._28_4_ = iVar3;
      auVar79 = vfmsub231ps_fma(auVar37,auVar113,auVar93);
      auVar38._4_4_ = fVar131 * auVar93._4_4_;
      auVar38._0_4_ = fVar78 * auVar93._0_4_;
      auVar38._8_4_ = fVar133 * auVar93._8_4_;
      auVar38._12_4_ = fVar135 * auVar93._12_4_;
      auVar38._16_4_ = auVar93._16_4_ * 0.0;
      auVar38._20_4_ = auVar93._20_4_ * 0.0;
      auVar38._24_4_ = auVar93._24_4_ * 0.0;
      auVar38._28_4_ = auVar100._28_4_;
      auVar81 = vfmsub231ps_fma(auVar38,auVar99,auVar103);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar106,ZEXT1632(auVar79));
      auVar155._0_4_ = auVar103._0_4_ * auVar113._0_4_;
      auVar155._4_4_ = auVar103._4_4_ * auVar113._4_4_;
      auVar155._8_4_ = auVar103._8_4_ * auVar113._8_4_;
      auVar155._12_4_ = auVar103._12_4_ * auVar113._12_4_;
      auVar155._16_4_ = auVar103._16_4_ * fVar165;
      auVar155._20_4_ = auVar103._20_4_ * fVar169;
      auVar155._24_4_ = auVar103._24_4_ * fVar168;
      auVar155._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar155,auVar92,auVar102);
      auVar104 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar79));
      auVar100 = vmulps_avx512vl(auVar98,auVar114);
      auVar100 = vfmsub231ps_avx512vl(auVar100,auVar101,auVar116);
      auVar39._4_4_ = auVar97._4_4_ * auVar116._4_4_;
      auVar39._0_4_ = auVar97._0_4_ * auVar116._0_4_;
      auVar39._8_4_ = auVar97._8_4_ * auVar116._8_4_;
      auVar39._12_4_ = auVar97._12_4_ * auVar116._12_4_;
      auVar39._16_4_ = auVar97._16_4_ * auVar116._16_4_;
      auVar39._20_4_ = auVar97._20_4_ * auVar116._20_4_;
      auVar39._24_4_ = auVar97._24_4_ * auVar116._24_4_;
      auVar39._28_4_ = auVar116._28_4_;
      auVar79 = vfmsub231ps_fma(auVar39,auVar115,auVar98);
      auVar156._0_4_ = auVar115._0_4_ * auVar101._0_4_;
      auVar156._4_4_ = auVar115._4_4_ * auVar101._4_4_;
      auVar156._8_4_ = auVar115._8_4_ * auVar101._8_4_;
      auVar156._12_4_ = auVar115._12_4_ * auVar101._12_4_;
      auVar156._16_4_ = fVar162 * auVar101._16_4_;
      auVar156._20_4_ = fVar161 * auVar101._20_4_;
      auVar156._24_4_ = fVar163 * auVar101._24_4_;
      auVar156._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar156,auVar97,auVar114);
      auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar106,auVar100);
      auVar105 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar79));
      auVar100 = vmaxps_avx(auVar104,auVar105);
      uVar144 = vcmpps_avx512vl(auVar100,auVar106,2);
      bVar74 = bVar74 & (byte)uVar144;
      auVar183 = ZEXT3264(local_3e0);
      auVar184 = ZEXT3264(local_400);
      auVar185 = ZEXT3264(local_420);
      auVar180 = ZEXT3264(local_580);
      auVar177 = ZEXT1664(auVar80);
      if (bVar74 == 0) {
        bVar69 = false;
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar189 = ZEXT3264(auVar100);
        auVar186 = ZEXT3264(local_4e0);
        auVar187 = ZEXT3264(local_4a0);
        auVar188 = ZEXT3264(local_4c0);
      }
      else {
        auVar40._4_4_ = auVar98._4_4_ * auVar103._4_4_;
        auVar40._0_4_ = auVar98._0_4_ * auVar103._0_4_;
        auVar40._8_4_ = auVar98._8_4_ * auVar103._8_4_;
        auVar40._12_4_ = auVar98._12_4_ * auVar103._12_4_;
        auVar40._16_4_ = auVar98._16_4_ * auVar103._16_4_;
        auVar40._20_4_ = auVar98._20_4_ * auVar103._20_4_;
        auVar40._24_4_ = auVar98._24_4_ * auVar103._24_4_;
        auVar40._28_4_ = auVar100._28_4_;
        auVar7 = vfmsub231ps_fma(auVar40,auVar97,auVar102);
        auVar41._4_4_ = auVar102._4_4_ * auVar101._4_4_;
        auVar41._0_4_ = auVar102._0_4_ * auVar101._0_4_;
        auVar41._8_4_ = auVar102._8_4_ * auVar101._8_4_;
        auVar41._12_4_ = auVar102._12_4_ * auVar101._12_4_;
        auVar41._16_4_ = auVar102._16_4_ * auVar101._16_4_;
        auVar41._20_4_ = auVar102._20_4_ * auVar101._20_4_;
        auVar41._24_4_ = auVar102._24_4_ * auVar101._24_4_;
        auVar41._28_4_ = auVar102._28_4_;
        auVar81 = vfmsub231ps_fma(auVar41,auVar93,auVar98);
        auVar42._4_4_ = auVar97._4_4_ * auVar93._4_4_;
        auVar42._0_4_ = auVar97._0_4_ * auVar93._0_4_;
        auVar42._8_4_ = auVar97._8_4_ * auVar93._8_4_;
        auVar42._12_4_ = auVar97._12_4_ * auVar93._12_4_;
        auVar42._16_4_ = auVar97._16_4_ * auVar93._16_4_;
        auVar42._20_4_ = auVar97._20_4_ * auVar93._20_4_;
        auVar42._24_4_ = auVar97._24_4_ * auVar93._24_4_;
        auVar42._28_4_ = auVar97._28_4_;
        auVar8 = vfmsub231ps_fma(auVar42,auVar101,auVar103);
        auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar8));
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar7),auVar106);
        auVar103 = vrcp14ps_avx512vl(auVar100);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar189 = ZEXT3264(auVar102);
        auVar101 = vfnmadd213ps_avx512vl(auVar103,auVar100,auVar102);
        auVar79 = vfmadd132ps_fma(auVar101,auVar103,auVar103);
        auVar43._4_4_ = auVar8._4_4_ * auVar113._4_4_;
        auVar43._0_4_ = auVar8._0_4_ * auVar113._0_4_;
        auVar43._8_4_ = auVar8._8_4_ * auVar113._8_4_;
        auVar43._12_4_ = auVar8._12_4_ * auVar113._12_4_;
        auVar43._16_4_ = fVar165 * 0.0;
        auVar43._20_4_ = fVar169 * 0.0;
        auVar43._24_4_ = fVar168 * 0.0;
        auVar43._28_4_ = iVar2;
        auVar81 = vfmadd231ps_fma(auVar43,auVar92,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar99,ZEXT1632(auVar7));
        fVar165 = auVar79._0_4_;
        fVar168 = auVar79._4_4_;
        fVar169 = auVar79._8_4_;
        fVar162 = auVar79._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar162,
                                       CONCAT48(auVar81._8_4_ * fVar169,
                                                CONCAT44(auVar81._4_4_ * fVar168,
                                                         auVar81._0_4_ * fVar165))));
        auVar164._4_4_ = uVar166;
        auVar164._0_4_ = uVar166;
        auVar164._8_4_ = uVar166;
        auVar164._12_4_ = uVar166;
        auVar164._16_4_ = uVar166;
        auVar164._20_4_ = uVar166;
        auVar164._24_4_ = uVar166;
        auVar164._28_4_ = uVar166;
        uVar144 = vcmpps_avx512vl(auVar164,local_240,2);
        uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar138;
        auVar23._0_4_ = uVar138;
        auVar23._8_4_ = uVar138;
        auVar23._12_4_ = uVar138;
        auVar23._16_4_ = uVar138;
        auVar23._20_4_ = uVar138;
        auVar23._24_4_ = uVar138;
        auVar23._28_4_ = uVar138;
        uVar22 = vcmpps_avx512vl(local_240,auVar23,2);
        bVar74 = (byte)uVar144 & (byte)uVar22 & bVar74;
        auVar187 = ZEXT3264(local_4a0);
        auVar188 = ZEXT3264(local_4c0);
        if (bVar74 == 0) {
          bVar69 = false;
          auVar186 = ZEXT3264(local_4e0);
        }
        else {
          uVar144 = vcmpps_avx512vl(auVar100,auVar106,4);
          bVar74 = bVar74 & (byte)uVar144;
          auVar186 = ZEXT3264(local_4e0);
          if (bVar74 != 0) {
            fVar161 = auVar104._0_4_ * fVar165;
            fVar163 = auVar104._4_4_ * fVar168;
            auVar44._4_4_ = fVar163;
            auVar44._0_4_ = fVar161;
            fVar77 = auVar104._8_4_ * fVar169;
            auVar44._8_4_ = fVar77;
            fVar78 = auVar104._12_4_ * fVar162;
            auVar44._12_4_ = fVar78;
            fVar130 = auVar104._16_4_ * 0.0;
            auVar44._16_4_ = fVar130;
            fVar131 = auVar104._20_4_ * 0.0;
            auVar44._20_4_ = fVar131;
            fVar132 = auVar104._24_4_ * 0.0;
            auVar44._24_4_ = fVar132;
            auVar44._28_4_ = auVar100._28_4_;
            auVar103 = vsubps_avx512vl(auVar102,auVar44);
            local_280._0_4_ =
                 (float)((uint)(bVar66 & 1) * (int)fVar161 |
                        (uint)!(bool)(bVar66 & 1) * auVar103._0_4_);
            bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar69 * (int)fVar163 | (uint)!bVar69 * auVar103._4_4_);
            bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar69 * (int)fVar77 | (uint)!bVar69 * auVar103._8_4_);
            bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar69 * (int)fVar78 | (uint)!bVar69 * auVar103._12_4_)
            ;
            bVar69 = (bool)((byte)(uVar76 >> 4) & 1);
            local_280._16_4_ =
                 (float)((uint)bVar69 * (int)fVar130 | (uint)!bVar69 * auVar103._16_4_);
            bVar69 = (bool)((byte)(uVar76 >> 5) & 1);
            local_280._20_4_ =
                 (float)((uint)bVar69 * (int)fVar131 | (uint)!bVar69 * auVar103._20_4_);
            bVar69 = (bool)((byte)(uVar76 >> 6) & 1);
            local_280._24_4_ =
                 (float)((uint)bVar69 * (int)fVar132 | (uint)!bVar69 * auVar103._24_4_);
            bVar69 = SUB81(uVar76 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * auVar103._28_4_);
            auVar100 = vsubps_avx(ZEXT1632(auVar11),auVar87);
            auVar79 = vfmadd213ps_fma(auVar100,local_280,auVar87);
            uVar138 = *(undefined4 *)((long)local_5e0->ray_space + k * 4 + -0x10);
            auVar87._4_4_ = uVar138;
            auVar87._0_4_ = uVar138;
            auVar87._8_4_ = uVar138;
            auVar87._12_4_ = uVar138;
            auVar87._16_4_ = uVar138;
            auVar87._20_4_ = uVar138;
            auVar87._24_4_ = uVar138;
            auVar87._28_4_ = uVar138;
            auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                          CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                   CONCAT44(auVar79._4_4_ +
                                                                            auVar79._4_4_,
                                                                            auVar79._0_4_ +
                                                                            auVar79._0_4_)))),
                                       auVar87);
            uVar144 = vcmpps_avx512vl(local_240,auVar100,6);
            if (((byte)uVar144 & bVar74) != 0) {
              auVar153._0_4_ = auVar105._0_4_ * fVar165;
              auVar153._4_4_ = auVar105._4_4_ * fVar168;
              auVar153._8_4_ = auVar105._8_4_ * fVar169;
              auVar153._12_4_ = auVar105._12_4_ * fVar162;
              auVar153._16_4_ = auVar105._16_4_ * 0.0;
              auVar153._20_4_ = auVar105._20_4_ * 0.0;
              auVar153._24_4_ = auVar105._24_4_ * 0.0;
              auVar153._28_4_ = 0;
              auVar100 = vsubps_avx512vl(auVar102,auVar153);
              auVar119._0_4_ =
                   (uint)(bVar66 & 1) * (int)auVar153._0_4_ |
                   (uint)!(bool)(bVar66 & 1) * auVar100._0_4_;
              bVar69 = (bool)((byte)(uVar76 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar69 * (int)auVar153._4_4_ | (uint)!bVar69 * auVar100._4_4_;
              bVar69 = (bool)((byte)(uVar76 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar69 * (int)auVar153._8_4_ | (uint)!bVar69 * auVar100._8_4_;
              bVar69 = (bool)((byte)(uVar76 >> 3) & 1);
              auVar119._12_4_ =
                   (uint)bVar69 * (int)auVar153._12_4_ | (uint)!bVar69 * auVar100._12_4_;
              bVar69 = (bool)((byte)(uVar76 >> 4) & 1);
              auVar119._16_4_ =
                   (uint)bVar69 * (int)auVar153._16_4_ | (uint)!bVar69 * auVar100._16_4_;
              bVar69 = (bool)((byte)(uVar76 >> 5) & 1);
              auVar119._20_4_ =
                   (uint)bVar69 * (int)auVar153._20_4_ | (uint)!bVar69 * auVar100._20_4_;
              bVar69 = (bool)((byte)(uVar76 >> 6) & 1);
              auVar119._24_4_ =
                   (uint)bVar69 * (int)auVar153._24_4_ | (uint)!bVar69 * auVar100._24_4_;
              auVar119._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar100._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar119,auVar102,auVar24);
              local_220 = 0;
              local_210 = local_4f0._0_8_;
              uStack_208 = local_4f0._8_8_;
              local_200 = local_500._0_8_;
              uStack_1f8 = local_500._8_8_;
              local_1f0 = local_510._0_8_;
              uStack_1e8 = local_510._8_8_;
              if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((local_5b8->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar69 = true, pGVar71->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01b05486;
                fVar150 = 1.0 / fVar150;
                local_1c0[0] = fVar150 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar150 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar150 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar150 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar150 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar150 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar150 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                uVar76 = 0;
                uVar70 = (ulong)((byte)uVar144 & bVar74);
                for (uVar75 = uVar70; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000)
                {
                  uVar76 = uVar76 + 1;
                }
                local_530 = vpbroadcastd_avx512vl();
                local_5d0 = auVar80;
                local_21c = iVar12;
                while( true ) {
                  local_340 = auVar177._0_4_;
                  auVar80 = auVar182._0_16_;
                  if (uVar70 == 0) break;
                  local_380 = *(float *)(ray + k * 4 + 0x80);
                  local_2e0 = local_1c0[uVar76];
                  local_2d0 = *(undefined4 *)(local_1a0 + uVar76 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar76 * 4);
                  local_5b0.context = pRVar65->user;
                  fVar165 = 1.0 - local_2e0;
                  fVar150 = fVar165 * fVar165 * -3.0;
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),
                                            ZEXT416((uint)(local_2e0 * fVar165)),ZEXT416(0xc0000000)
                                           );
                  auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_2e0 * fVar165)),
                                            ZEXT416((uint)(local_2e0 * local_2e0)),
                                            ZEXT416(0x40000000));
                  fVar165 = auVar79._0_4_ * 3.0;
                  fVar168 = auVar81._0_4_ * 3.0;
                  fVar169 = local_2e0 * local_2e0 * 3.0;
                  auVar159._0_4_ = fVar169 * (float)local_390._0_4_;
                  auVar159._4_4_ = fVar169 * (float)local_390._4_4_;
                  auVar159._8_4_ = fVar169 * fStack_388;
                  auVar159._12_4_ = fVar169 * fStack_384;
                  auVar140._4_4_ = fVar168;
                  auVar140._0_4_ = fVar168;
                  auVar140._8_4_ = fVar168;
                  auVar140._12_4_ = fVar168;
                  auVar79 = vfmadd132ps_fma(auVar140,auVar159,local_510);
                  auVar151._4_4_ = fVar165;
                  auVar151._0_4_ = fVar165;
                  auVar151._8_4_ = fVar165;
                  auVar151._12_4_ = fVar165;
                  auVar79 = vfmadd132ps_fma(auVar151,auVar79,local_500);
                  auVar141._4_4_ = fVar150;
                  auVar141._0_4_ = fVar150;
                  auVar141._8_4_ = fVar150;
                  auVar141._12_4_ = fVar150;
                  auVar79 = vfmadd132ps_fma(auVar141,auVar79,local_4f0);
                  local_310 = auVar79._0_4_;
                  local_300 = vshufps_avx(auVar79,auVar79,0x55);
                  local_2f0 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_2c0 = local_3a0._0_8_;
                  uStack_2b8 = local_3a0._8_8_;
                  local_2b0 = local_530;
                  vpcmpeqd_avx2(ZEXT1632(local_530),ZEXT1632(local_530));
                  uStack_29c = (local_5b0.context)->instID[0];
                  local_2a0 = uStack_29c;
                  uStack_298 = uStack_29c;
                  uStack_294 = uStack_29c;
                  uStack_290 = (local_5b0.context)->instPrimID[0];
                  uStack_28c = uStack_290;
                  uStack_288 = uStack_290;
                  uStack_284 = uStack_290;
                  local_5f0 = local_3b0;
                  local_5b0.valid = (int *)local_5f0;
                  local_5b0.geometryUserPtr = pGVar71->userPtr;
                  local_5b0.hit = (RTCHitN *)&local_310;
                  local_5b0.N = 4;
                  local_340 = (float)uVar70;
                  fStack_33c = (float)(uVar70 >> 0x20);
                  local_360 = (uint)uVar76;
                  uStack_35c = (uint)(uVar76 >> 0x20);
                  local_5b0.ray = (RTCRayN *)ray;
                  uStack_30c = local_310;
                  uStack_308 = local_310;
                  uStack_304 = local_310;
                  fStack_2dc = local_2e0;
                  fStack_2d8 = local_2e0;
                  fStack_2d4 = local_2e0;
                  uStack_2cc = local_2d0;
                  uStack_2c8 = local_2d0;
                  uStack_2c4 = local_2d0;
                  if (pGVar71->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar71->occlusionFilterN)(&local_5b0);
                    uVar76 = CONCAT44(uStack_35c,local_360);
                    uVar70 = CONCAT44(fStack_33c,local_340);
                    auVar177 = ZEXT1664(local_5d0);
                    auVar188 = ZEXT3264(local_4c0);
                    auVar187 = ZEXT3264(local_4a0);
                    auVar186 = ZEXT3264(local_4e0);
                    auVar180 = ZEXT3264(local_580);
                    auVar181 = ZEXT3264(local_560);
                    auVar185 = ZEXT3264(local_420);
                    auVar184 = ZEXT3264(local_400);
                    auVar183 = ZEXT3264(local_3e0);
                    auVar80 = vxorps_avx512vl(auVar80,auVar80);
                    auVar182 = ZEXT1664(auVar80);
                    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar189 = ZEXT3264(auVar100);
                    uVar166 = local_440._0_4_;
                  }
                  auVar80 = auVar182._0_16_;
                  uVar75 = vptestmd_avx512vl(local_5f0,local_5f0);
                  if ((uVar75 & 0xf) != 0) {
                    p_Var15 = pRVar65->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((pRVar65->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_5b0);
                      uVar76 = CONCAT44(uStack_35c,local_360);
                      uVar70 = CONCAT44(fStack_33c,local_340);
                      auVar177 = ZEXT1664(local_5d0);
                      auVar188 = ZEXT3264(local_4c0);
                      auVar187 = ZEXT3264(local_4a0);
                      auVar186 = ZEXT3264(local_4e0);
                      auVar180 = ZEXT3264(local_580);
                      auVar181 = ZEXT3264(local_560);
                      auVar185 = ZEXT3264(local_420);
                      auVar184 = ZEXT3264(local_400);
                      auVar183 = ZEXT3264(local_3e0);
                      auVar80 = vxorps_avx512vl(auVar80,auVar80);
                      auVar182 = ZEXT1664(auVar80);
                      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar189 = ZEXT3264(auVar100);
                      uVar166 = local_440._0_4_;
                    }
                    local_340 = auVar177._0_4_;
                    auVar80 = *(undefined1 (*) [16])(local_5b0.ray + 0x80);
                    uVar75 = vptestmd_avx512vl(local_5f0,local_5f0);
                    uVar75 = uVar75 & 0xf;
                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar69 = (bool)((byte)uVar75 & 1);
                    auVar85._0_4_ = (uint)bVar69 * auVar79._0_4_ | (uint)!bVar69 * auVar80._0_4_;
                    bVar69 = (bool)((byte)(uVar75 >> 1) & 1);
                    auVar85._4_4_ = (uint)bVar69 * auVar79._4_4_ | (uint)!bVar69 * auVar80._4_4_;
                    bVar69 = (bool)((byte)(uVar75 >> 2) & 1);
                    auVar85._8_4_ = (uint)bVar69 * auVar79._8_4_ | (uint)!bVar69 * auVar80._8_4_;
                    bVar69 = SUB81(uVar75 >> 3,0);
                    auVar85._12_4_ = (uint)bVar69 * auVar79._12_4_ | (uint)!bVar69 * auVar80._12_4_;
                    *(undefined1 (*) [16])(local_5b0.ray + 0x80) = auVar85;
                    if ((byte)uVar75 != 0) {
                      bVar69 = true;
                      goto LAB_01b05486;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = local_380;
                  uVar75 = uVar76 & 0x3f;
                  uVar76 = 0;
                  uVar70 = uVar70 ^ 1L << uVar75;
                  for (uVar75 = uVar70; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000
                      ) {
                    uVar76 = uVar76 + 1;
                  }
                }
              }
            }
          }
          bVar69 = false;
        }
      }
    }
LAB_01b05486:
    if (8 < iVar12) {
      local_440 = vpbroadcastd_avx512vl();
      local_380 = 1.0 / (float)local_520._0_4_;
      local_520 = vpbroadcastd_avx512vl();
      fStack_37c = local_380;
      fStack_378 = local_380;
      fStack_374 = local_380;
      fStack_370 = local_380;
      fStack_36c = local_380;
      fStack_368 = local_380;
      fStack_364 = local_380;
      local_360 = uVar166;
      uStack_35c = uVar166;
      uStack_358 = uVar166;
      uStack_354 = uVar166;
      uStack_350 = uVar166;
      uStack_34c = uVar166;
      uStack_348 = uVar166;
      uStack_344 = uVar166;
      fStack_33c = local_340;
      fStack_338 = local_340;
      fStack_334 = local_340;
      fStack_330 = local_340;
      fStack_32c = local_340;
      fStack_328 = local_340;
      fStack_324 = local_340;
      for (lVar73 = 8; lVar73 < iVar12; lVar73 = lVar73 + 8) {
        auVar100 = vpbroadcastd_avx512vl();
        auVar97 = vpor_avx2(auVar100,_DAT_01fb4ba0);
        uVar22 = vpcmpd_avx512vl(auVar97,local_440,1);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 * 4 + lVar67);
        auVar103 = *(undefined1 (*) [32])(lVar67 + 0x21fb768 + lVar73 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar67 + 0x21fbbec + lVar73 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar67 + 0x21fc070 + lVar73 * 4);
        local_4a0 = auVar187._0_32_;
        auVar98 = vmulps_avx512vl(local_4a0,auVar101);
        local_4c0 = auVar188._0_32_;
        auVar99 = vmulps_avx512vl(local_4c0,auVar101);
        auVar45._4_4_ = auVar101._4_4_ * (float)local_100._4_4_;
        auVar45._0_4_ = auVar101._0_4_ * (float)local_100._0_4_;
        auVar45._8_4_ = auVar101._8_4_ * fStack_f8;
        auVar45._12_4_ = auVar101._12_4_ * fStack_f4;
        auVar45._16_4_ = auVar101._16_4_ * fStack_f0;
        auVar45._20_4_ = auVar101._20_4_ * fStack_ec;
        auVar45._24_4_ = auVar101._24_4_ * fStack_e8;
        auVar45._28_4_ = auVar97._28_4_;
        auVar90 = auVar180._0_32_;
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar90);
        local_4e0 = auVar186._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar102,local_4e0);
        auVar99 = vfmadd231ps_avx512vl(auVar45,auVar102,local_e0);
        auVar95 = auVar185._0_32_;
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar95);
        auVar91 = auVar181._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar91);
        auVar80 = vfmadd231ps_fma(auVar99,auVar103,local_c0);
        local_3e0 = auVar183._0_32_;
        auVar105 = vfmadd231ps_avx512vl(auVar97,auVar100,local_3e0);
        auVar94 = auVar184._0_32_;
        auVar106 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar94);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 * 4 + lVar67);
        auVar98 = *(undefined1 (*) [32])(lVar67 + 0x21fdb88 + lVar73 * 4);
        auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar100,local_a0);
        auVar99 = *(undefined1 (*) [32])(lVar67 + 0x21fe00c + lVar73 * 4);
        auVar92 = *(undefined1 (*) [32])(lVar67 + 0x21fe490 + lVar73 * 4);
        auVar93 = vmulps_avx512vl(local_4a0,auVar92);
        auVar104 = vmulps_avx512vl(local_4c0,auVar92);
        auVar46._4_4_ = auVar92._4_4_ * (float)local_100._4_4_;
        auVar46._0_4_ = auVar92._0_4_ * (float)local_100._0_4_;
        auVar46._8_4_ = auVar92._8_4_ * fStack_f8;
        auVar46._12_4_ = auVar92._12_4_ * fStack_f4;
        auVar46._16_4_ = auVar92._16_4_ * fStack_f0;
        auVar46._20_4_ = auVar92._20_4_ * fStack_ec;
        auVar46._24_4_ = auVar92._24_4_ * fStack_e8;
        auVar46._28_4_ = uStack_e4;
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar90);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,local_4e0);
        auVar107 = vfmadd231ps_avx512vl(auVar46,auVar99,local_e0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar95);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar98,auVar91);
        auVar79 = vfmadd231ps_fma(auVar107,auVar98,local_c0);
        auVar107 = vfmadd231ps_avx512vl(auVar93,auVar97,local_3e0);
        auVar108 = vfmadd231ps_avx512vl(auVar104,auVar97,auVar94);
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar97,local_a0);
        auVar87 = vmaxps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar79));
        auVar93 = vsubps_avx(auVar107,auVar105);
        auVar104 = vsubps_avx(auVar108,auVar106);
        auVar88 = vmulps_avx512vl(auVar106,auVar93);
        auVar89 = vmulps_avx512vl(auVar105,auVar104);
        auVar88 = vsubps_avx512vl(auVar88,auVar89);
        auVar89 = vmulps_avx512vl(auVar104,auVar104);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar93);
        auVar87 = vmulps_avx512vl(auVar87,auVar87);
        auVar87 = vmulps_avx512vl(auVar87,auVar89);
        auVar88 = vmulps_avx512vl(auVar88,auVar88);
        uVar144 = vcmpps_avx512vl(auVar88,auVar87,2);
        bVar74 = (byte)uVar22 & (byte)uVar144;
        if (bVar74 == 0) {
          auVar181 = ZEXT3264(auVar91);
          auVar180 = ZEXT3264(auVar90);
        }
        else {
          auVar92 = vmulps_avx512vl(local_480,auVar92);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_160,auVar92);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar99);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar98);
          auVar101 = vmulps_avx512vl(local_480,auVar101);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar101);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_140,auVar102);
          auVar98 = vfmadd213ps_avx512vl(auVar100,local_120,auVar103);
          auVar100 = *(undefined1 (*) [32])(lVar67 + 0x21fc4f4 + lVar73 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar67 + 0x21fc978 + lVar73 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar67 + 0x21fcdfc + lVar73 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar67 + 0x21fd280 + lVar73 * 4);
          auVar99 = vmulps_avx512vl(local_4a0,auVar101);
          auVar92 = vmulps_avx512vl(local_4c0,auVar101);
          auVar101 = vmulps_avx512vl(local_480,auVar101);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,auVar90);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar102,local_4e0);
          auVar102 = vfmadd231ps_avx512vl(auVar101,local_160,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar95);
          auVar99 = vfmadd231ps_avx512vl(auVar92,auVar103,auVar91);
          auVar103 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_3e0);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar100,auVar94);
          auVar92 = vfmadd231ps_avx512vl(auVar103,local_120,auVar100);
          auVar100 = *(undefined1 (*) [32])(lVar67 + 0x21fe914 + lVar73 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar67 + 0x21ff21c + lVar73 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar67 + 0x21ff6a0 + lVar73 * 4);
          auVar87 = vmulps_avx512vl(local_4a0,auVar102);
          auVar88 = vmulps_avx512vl(local_4c0,auVar102);
          auVar102 = vmulps_avx512vl(local_480,auVar102);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar103,auVar90);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar103,local_4e0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_160,auVar103);
          auVar103 = *(undefined1 (*) [32])(lVar67 + 0x21fed98 + lVar73 * 4);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar103,auVar95);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar103,auVar91);
          auVar103 = vfmadd231ps_avx512vl(auVar102,local_140,auVar103);
          auVar102 = vfmadd231ps_avx512vl(auVar87,auVar100,local_3e0);
          auVar87 = vfmadd231ps_avx512vl(auVar88,auVar100,auVar94);
          auVar103 = vfmadd231ps_avx512vl(auVar103,local_120,auVar100);
          auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar101,auVar88);
          vandps_avx512vl(auVar99,auVar88);
          auVar100 = vmaxps_avx(auVar88,auVar88);
          vandps_avx512vl(auVar92,auVar88);
          auVar100 = vmaxps_avx(auVar100,auVar88);
          auVar64._4_4_ = fStack_33c;
          auVar64._0_4_ = local_340;
          auVar64._8_4_ = fStack_338;
          auVar64._12_4_ = fStack_334;
          auVar64._16_4_ = fStack_330;
          auVar64._20_4_ = fStack_32c;
          auVar64._24_4_ = fStack_328;
          auVar64._28_4_ = fStack_324;
          uVar76 = vcmpps_avx512vl(auVar100,auVar64,1);
          bVar16 = (bool)((byte)uVar76 & 1);
          auVar120._0_4_ = (float)((uint)bVar16 * auVar93._0_4_ | (uint)!bVar16 * auVar101._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar101._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar101._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar101._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * auVar101._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * auVar101._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * auVar101._24_4_)
          ;
          bVar16 = SUB81(uVar76 >> 7,0);
          auVar120._28_4_ = (uint)bVar16 * auVar93._28_4_ | (uint)!bVar16 * auVar101._28_4_;
          bVar16 = (bool)((byte)uVar76 & 1);
          auVar121._0_4_ = (float)((uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * auVar99._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar99._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar99._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar99._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar99._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar99._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar99._24_4_)
          ;
          bVar16 = SUB81(uVar76 >> 7,0);
          auVar121._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar99._28_4_;
          vandps_avx512vl(auVar102,auVar88);
          vandps_avx512vl(auVar87,auVar88);
          auVar100 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar103,auVar88);
          auVar100 = vmaxps_avx(auVar100,auVar121);
          uVar76 = vcmpps_avx512vl(auVar100,auVar64,1);
          bVar16 = (bool)((byte)uVar76 & 1);
          auVar122._0_4_ = (uint)bVar16 * auVar93._0_4_ | (uint)!bVar16 * auVar102._0_4_;
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar102._4_4_;
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar102._8_4_;
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar102._12_4_;
          bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar16 * auVar93._16_4_ | (uint)!bVar16 * auVar102._16_4_;
          bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar16 * auVar93._20_4_ | (uint)!bVar16 * auVar102._20_4_;
          bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar16 * auVar93._24_4_ | (uint)!bVar16 * auVar102._24_4_;
          bVar16 = SUB81(uVar76 >> 7,0);
          auVar122._28_4_ = (uint)bVar16 * auVar93._28_4_ | (uint)!bVar16 * auVar102._28_4_;
          bVar16 = (bool)((byte)uVar76 & 1);
          auVar123._0_4_ = (float)((uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * auVar87._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar87._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar87._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar87._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar87._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar87._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar87._24_4_)
          ;
          bVar16 = SUB81(uVar76 >> 7,0);
          auVar123._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar87._28_4_;
          auVar172._8_4_ = 0x80000000;
          auVar172._0_8_ = 0x8000000080000000;
          auVar172._12_4_ = 0x80000000;
          auVar172._16_4_ = 0x80000000;
          auVar172._20_4_ = 0x80000000;
          auVar172._24_4_ = 0x80000000;
          auVar172._28_4_ = 0x80000000;
          auVar100 = vxorps_avx512vl(auVar122,auVar172);
          auVar87 = auVar182._0_32_;
          auVar103 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar87);
          auVar81 = vfmadd231ps_fma(auVar103,auVar121,auVar121);
          auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
          auVar179._8_4_ = 0xbf000000;
          auVar179._0_8_ = 0xbf000000bf000000;
          auVar179._12_4_ = 0xbf000000;
          auVar179._16_4_ = 0xbf000000;
          auVar179._20_4_ = 0xbf000000;
          auVar179._24_4_ = 0xbf000000;
          auVar179._28_4_ = 0xbf000000;
          fVar150 = auVar103._0_4_;
          fVar165 = auVar103._4_4_;
          fVar168 = auVar103._8_4_;
          fVar169 = auVar103._12_4_;
          fVar162 = auVar103._16_4_;
          fVar161 = auVar103._20_4_;
          fVar163 = auVar103._24_4_;
          auVar47._4_4_ = fVar165 * fVar165 * fVar165 * auVar81._4_4_ * -0.5;
          auVar47._0_4_ = fVar150 * fVar150 * fVar150 * auVar81._0_4_ * -0.5;
          auVar47._8_4_ = fVar168 * fVar168 * fVar168 * auVar81._8_4_ * -0.5;
          auVar47._12_4_ = fVar169 * fVar169 * fVar169 * auVar81._12_4_ * -0.5;
          auVar47._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
          auVar47._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar47._24_4_ = fVar163 * fVar163 * fVar163 * -0.0;
          auVar47._28_4_ = auVar121._28_4_;
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar103 = vfmadd231ps_avx512vl(auVar47,auVar102,auVar103);
          auVar48._4_4_ = auVar121._4_4_ * auVar103._4_4_;
          auVar48._0_4_ = auVar121._0_4_ * auVar103._0_4_;
          auVar48._8_4_ = auVar121._8_4_ * auVar103._8_4_;
          auVar48._12_4_ = auVar121._12_4_ * auVar103._12_4_;
          auVar48._16_4_ = auVar121._16_4_ * auVar103._16_4_;
          auVar48._20_4_ = auVar121._20_4_ * auVar103._20_4_;
          auVar48._24_4_ = auVar121._24_4_ * auVar103._24_4_;
          auVar48._28_4_ = 0;
          auVar49._4_4_ = auVar103._4_4_ * -auVar120._4_4_;
          auVar49._0_4_ = auVar103._0_4_ * -auVar120._0_4_;
          auVar49._8_4_ = auVar103._8_4_ * -auVar120._8_4_;
          auVar49._12_4_ = auVar103._12_4_ * -auVar120._12_4_;
          auVar49._16_4_ = auVar103._16_4_ * -auVar120._16_4_;
          auVar49._20_4_ = auVar103._20_4_ * -auVar120._20_4_;
          auVar49._24_4_ = auVar103._24_4_ * -auVar120._24_4_;
          auVar49._28_4_ = auVar121._28_4_;
          auVar101 = vmulps_avx512vl(auVar103,auVar87);
          auVar103 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar87);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar123,auVar123);
          auVar99 = vrsqrt14ps_avx512vl(auVar103);
          auVar103 = vmulps_avx512vl(auVar103,auVar179);
          fVar150 = auVar99._0_4_;
          fVar165 = auVar99._4_4_;
          fVar168 = auVar99._8_4_;
          fVar169 = auVar99._12_4_;
          fVar162 = auVar99._16_4_;
          fVar161 = auVar99._20_4_;
          fVar163 = auVar99._24_4_;
          auVar50._4_4_ = fVar165 * fVar165 * fVar165 * auVar103._4_4_;
          auVar50._0_4_ = fVar150 * fVar150 * fVar150 * auVar103._0_4_;
          auVar50._8_4_ = fVar168 * fVar168 * fVar168 * auVar103._8_4_;
          auVar50._12_4_ = fVar169 * fVar169 * fVar169 * auVar103._12_4_;
          auVar50._16_4_ = fVar162 * fVar162 * fVar162 * auVar103._16_4_;
          auVar50._20_4_ = fVar161 * fVar161 * fVar161 * auVar103._20_4_;
          auVar50._24_4_ = fVar163 * fVar163 * fVar163 * auVar103._24_4_;
          auVar50._28_4_ = auVar103._28_4_;
          auVar103 = vfmadd231ps_avx512vl(auVar50,auVar102,auVar99);
          auVar51._4_4_ = auVar123._4_4_ * auVar103._4_4_;
          auVar51._0_4_ = auVar123._0_4_ * auVar103._0_4_;
          auVar51._8_4_ = auVar123._8_4_ * auVar103._8_4_;
          auVar51._12_4_ = auVar123._12_4_ * auVar103._12_4_;
          auVar51._16_4_ = auVar123._16_4_ * auVar103._16_4_;
          auVar51._20_4_ = auVar123._20_4_ * auVar103._20_4_;
          auVar51._24_4_ = auVar123._24_4_ * auVar103._24_4_;
          auVar51._28_4_ = auVar99._28_4_;
          auVar52._4_4_ = auVar103._4_4_ * auVar100._4_4_;
          auVar52._0_4_ = auVar103._0_4_ * auVar100._0_4_;
          auVar52._8_4_ = auVar103._8_4_ * auVar100._8_4_;
          auVar52._12_4_ = auVar103._12_4_ * auVar100._12_4_;
          auVar52._16_4_ = auVar103._16_4_ * auVar100._16_4_;
          auVar52._20_4_ = auVar103._20_4_ * auVar100._20_4_;
          auVar52._24_4_ = auVar103._24_4_ * auVar100._24_4_;
          auVar52._28_4_ = auVar100._28_4_;
          auVar100 = vmulps_avx512vl(auVar103,auVar87);
          auVar81 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar80),auVar105);
          auVar103 = ZEXT1632(auVar80);
          auVar7 = vfmadd213ps_fma(auVar49,auVar103,auVar106);
          auVar102 = vfmadd213ps_avx512vl(auVar101,auVar103,auVar98);
          auVar99 = vfmadd213ps_avx512vl(auVar51,ZEXT1632(auVar79),auVar107);
          auVar82 = vfnmadd213ps_fma(auVar48,auVar103,auVar105);
          auVar92 = ZEXT1632(auVar79);
          auVar8 = vfmadd213ps_fma(auVar52,auVar92,auVar108);
          auVar83 = vfnmadd213ps_fma(auVar49,auVar103,auVar106);
          auVar9 = vfmadd213ps_fma(auVar100,auVar92,auVar97);
          auVar106 = ZEXT1632(auVar80);
          auVar146 = vfnmadd231ps_fma(auVar98,auVar106,auVar101);
          auVar139 = vfnmadd213ps_fma(auVar51,auVar92,auVar107);
          auVar145 = vfnmadd213ps_fma(auVar52,auVar92,auVar108);
          auVar84 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar79),auVar100);
          auVar97 = vsubps_avx512vl(auVar99,ZEXT1632(auVar82));
          auVar100 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar83));
          auVar103 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar146));
          auVar53._4_4_ = auVar100._4_4_ * auVar146._4_4_;
          auVar53._0_4_ = auVar100._0_4_ * auVar146._0_4_;
          auVar53._8_4_ = auVar100._8_4_ * auVar146._8_4_;
          auVar53._12_4_ = auVar100._12_4_ * auVar146._12_4_;
          auVar53._16_4_ = auVar100._16_4_ * 0.0;
          auVar53._20_4_ = auVar100._20_4_ * 0.0;
          auVar53._24_4_ = auVar100._24_4_ * 0.0;
          auVar53._28_4_ = auVar101._28_4_;
          auVar80 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar83),auVar103);
          auVar54._4_4_ = auVar103._4_4_ * auVar82._4_4_;
          auVar54._0_4_ = auVar103._0_4_ * auVar82._0_4_;
          auVar54._8_4_ = auVar103._8_4_ * auVar82._8_4_;
          auVar54._12_4_ = auVar103._12_4_ * auVar82._12_4_;
          auVar54._16_4_ = auVar103._16_4_ * 0.0;
          auVar54._20_4_ = auVar103._20_4_ * 0.0;
          auVar54._24_4_ = auVar103._24_4_ * 0.0;
          auVar54._28_4_ = auVar103._28_4_;
          auVar10 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar146),auVar97);
          auVar55._4_4_ = auVar83._4_4_ * auVar97._4_4_;
          auVar55._0_4_ = auVar83._0_4_ * auVar97._0_4_;
          auVar55._8_4_ = auVar83._8_4_ * auVar97._8_4_;
          auVar55._12_4_ = auVar83._12_4_ * auVar97._12_4_;
          auVar55._16_4_ = auVar97._16_4_ * 0.0;
          auVar55._20_4_ = auVar97._20_4_ * 0.0;
          auVar55._24_4_ = auVar97._24_4_ * 0.0;
          auVar55._28_4_ = auVar97._28_4_;
          auVar11 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar82),auVar100);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar87,ZEXT1632(auVar10));
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar87,ZEXT1632(auVar80));
          uVar76 = vcmpps_avx512vl(auVar100,auVar87,2);
          bVar66 = (byte)uVar76;
          fVar130 = (float)((uint)(bVar66 & 1) * auVar81._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar139._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          fVar132 = (float)((uint)bVar16 * auVar81._4_4_ | (uint)!bVar16 * auVar139._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          fVar134 = (float)((uint)bVar16 * auVar81._8_4_ | (uint)!bVar16 * auVar139._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          fVar136 = (float)((uint)bVar16 * auVar81._12_4_ | (uint)!bVar16 * auVar139._12_4_);
          auVar92 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar130))));
          fVar131 = (float)((uint)(bVar66 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar145._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          fVar133 = (float)((uint)bVar16 * auVar7._4_4_ | (uint)!bVar16 * auVar145._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          fVar135 = (float)((uint)bVar16 * auVar7._8_4_ | (uint)!bVar16 * auVar145._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          fVar137 = (float)((uint)bVar16 * auVar7._12_4_ | (uint)!bVar16 * auVar145._12_4_);
          auVar93 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar131))));
          auVar124._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar102._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar84._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar84._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar84._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar84._12_4_)
          ;
          fVar150 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar102._16_4_);
          auVar124._16_4_ = fVar150;
          fVar165 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar102._20_4_);
          auVar124._20_4_ = fVar165;
          fVar168 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar102._24_4_);
          auVar124._24_4_ = fVar168;
          iVar2 = (uint)(byte)(uVar76 >> 7) * auVar102._28_4_;
          auVar124._28_4_ = iVar2;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar99);
          auVar125._0_4_ =
               (uint)(bVar66 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar80._0_4_;
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar80._4_4_;
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar80._8_4_;
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar80._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar8));
          auVar126._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar81._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar81._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar81._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar81._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
          auVar126._16_4_ = fVar169;
          fVar162 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
          auVar126._20_4_ = fVar162;
          fVar161 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
          auVar126._24_4_ = fVar161;
          auVar126._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
          auVar100 = vblendmps_avx512vl(ZEXT1632(auVar146),ZEXT1632(auVar9));
          auVar127._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar7._0_4_);
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar7._4_4_);
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar7._8_4_);
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar7._12_4_);
          fVar77 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
          auVar127._16_4_ = fVar77;
          fVar78 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
          auVar127._20_4_ = fVar78;
          fVar163 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
          auVar127._24_4_ = fVar163;
          iVar3 = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
          auVar127._28_4_ = iVar3;
          auVar128._0_4_ =
               (uint)(bVar66 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar99._0_4_;
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar16 * (int)auVar82._4_4_ | (uint)!bVar16 * auVar99._4_4_;
          bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar16 * (int)auVar82._8_4_ | (uint)!bVar16 * auVar99._8_4_;
          bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar16 * (int)auVar82._12_4_ | (uint)!bVar16 * auVar99._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar99._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar99._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar99._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar99._28_4_;
          bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar76 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar76 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar76 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar99 = vsubps_avx512vl(auVar128,auVar92);
          auVar103 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar83._12_4_ |
                                                   (uint)!bVar20 * auVar8._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar83._8_4_ |
                                                            (uint)!bVar19 * auVar8._8_4_,
                                                            CONCAT44((uint)bVar16 *
                                                                     (int)auVar83._4_4_ |
                                                                     (uint)!bVar16 * auVar8._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar83._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar8._0_4_)))),auVar93);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar146._12_4_ |
                                                   (uint)!bVar21 * auVar9._12_4_,
                                                   CONCAT48((uint)bVar18 * (int)auVar146._8_4_ |
                                                            (uint)!bVar18 * auVar9._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar146._4_4_ |
                                                                     (uint)!bVar17 * auVar9._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar146._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar9._0_4_)))),auVar124);
          auVar101 = vsubps_avx(auVar92,auVar125);
          auVar97 = vsubps_avx(auVar93,auVar126);
          auVar98 = vsubps_avx(auVar124,auVar127);
          auVar56._4_4_ = auVar102._4_4_ * fVar132;
          auVar56._0_4_ = auVar102._0_4_ * fVar130;
          auVar56._8_4_ = auVar102._8_4_ * fVar134;
          auVar56._12_4_ = auVar102._12_4_ * fVar136;
          auVar56._16_4_ = auVar102._16_4_ * 0.0;
          auVar56._20_4_ = auVar102._20_4_ * 0.0;
          auVar56._24_4_ = auVar102._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar56,auVar124,auVar99);
          auVar154._0_4_ = fVar131 * auVar99._0_4_;
          auVar154._4_4_ = fVar133 * auVar99._4_4_;
          auVar154._8_4_ = fVar135 * auVar99._8_4_;
          auVar154._12_4_ = fVar137 * auVar99._12_4_;
          auVar154._16_4_ = auVar99._16_4_ * 0.0;
          auVar154._20_4_ = auVar99._20_4_ * 0.0;
          auVar154._24_4_ = auVar99._24_4_ * 0.0;
          auVar154._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar154,auVar92,auVar103);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar87,ZEXT1632(auVar80));
          auVar157._0_4_ = auVar103._0_4_ * auVar124._0_4_;
          auVar157._4_4_ = auVar103._4_4_ * auVar124._4_4_;
          auVar157._8_4_ = auVar103._8_4_ * auVar124._8_4_;
          auVar157._12_4_ = auVar103._12_4_ * auVar124._12_4_;
          auVar157._16_4_ = auVar103._16_4_ * fVar150;
          auVar157._20_4_ = auVar103._20_4_ * fVar165;
          auVar157._24_4_ = auVar103._24_4_ * fVar168;
          auVar157._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar157,auVar93,auVar102);
          auVar104 = vfmadd231ps_avx512vl(auVar100,auVar87,ZEXT1632(auVar80));
          auVar100 = vmulps_avx512vl(auVar98,auVar125);
          auVar100 = vfmsub231ps_avx512vl(auVar100,auVar101,auVar127);
          auVar57._4_4_ = auVar97._4_4_ * auVar127._4_4_;
          auVar57._0_4_ = auVar97._0_4_ * auVar127._0_4_;
          auVar57._8_4_ = auVar97._8_4_ * auVar127._8_4_;
          auVar57._12_4_ = auVar97._12_4_ * auVar127._12_4_;
          auVar57._16_4_ = auVar97._16_4_ * fVar77;
          auVar57._20_4_ = auVar97._20_4_ * fVar78;
          auVar57._24_4_ = auVar97._24_4_ * fVar163;
          auVar57._28_4_ = iVar3;
          auVar80 = vfmsub231ps_fma(auVar57,auVar126,auVar98);
          auVar158._0_4_ = auVar126._0_4_ * auVar101._0_4_;
          auVar158._4_4_ = auVar126._4_4_ * auVar101._4_4_;
          auVar158._8_4_ = auVar126._8_4_ * auVar101._8_4_;
          auVar158._12_4_ = auVar126._12_4_ * auVar101._12_4_;
          auVar158._16_4_ = fVar169 * auVar101._16_4_;
          auVar158._20_4_ = fVar162 * auVar101._20_4_;
          auVar158._24_4_ = fVar161 * auVar101._24_4_;
          auVar158._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar158,auVar97,auVar125);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar87,auVar100);
          auVar105 = vfmadd231ps_avx512vl(auVar100,auVar87,ZEXT1632(auVar80));
          auVar100 = vmaxps_avx(auVar104,auVar105);
          uVar144 = vcmpps_avx512vl(auVar100,auVar87,2);
          bVar74 = bVar74 & (byte)uVar144;
          if (bVar74 != 0) {
            auVar58._4_4_ = auVar98._4_4_ * auVar103._4_4_;
            auVar58._0_4_ = auVar98._0_4_ * auVar103._0_4_;
            auVar58._8_4_ = auVar98._8_4_ * auVar103._8_4_;
            auVar58._12_4_ = auVar98._12_4_ * auVar103._12_4_;
            auVar58._16_4_ = auVar98._16_4_ * auVar103._16_4_;
            auVar58._20_4_ = auVar98._20_4_ * auVar103._20_4_;
            auVar58._24_4_ = auVar98._24_4_ * auVar103._24_4_;
            auVar58._28_4_ = auVar100._28_4_;
            auVar7 = vfmsub231ps_fma(auVar58,auVar97,auVar102);
            auVar59._4_4_ = auVar102._4_4_ * auVar101._4_4_;
            auVar59._0_4_ = auVar102._0_4_ * auVar101._0_4_;
            auVar59._8_4_ = auVar102._8_4_ * auVar101._8_4_;
            auVar59._12_4_ = auVar102._12_4_ * auVar101._12_4_;
            auVar59._16_4_ = auVar102._16_4_ * auVar101._16_4_;
            auVar59._20_4_ = auVar102._20_4_ * auVar101._20_4_;
            auVar59._24_4_ = auVar102._24_4_ * auVar101._24_4_;
            auVar59._28_4_ = auVar102._28_4_;
            auVar81 = vfmsub231ps_fma(auVar59,auVar99,auVar98);
            auVar60._4_4_ = auVar97._4_4_ * auVar99._4_4_;
            auVar60._0_4_ = auVar97._0_4_ * auVar99._0_4_;
            auVar60._8_4_ = auVar97._8_4_ * auVar99._8_4_;
            auVar60._12_4_ = auVar97._12_4_ * auVar99._12_4_;
            auVar60._16_4_ = auVar97._16_4_ * auVar99._16_4_;
            auVar60._20_4_ = auVar97._20_4_ * auVar99._20_4_;
            auVar60._24_4_ = auVar97._24_4_ * auVar99._24_4_;
            auVar60._28_4_ = auVar97._28_4_;
            auVar8 = vfmsub231ps_fma(auVar60,auVar101,auVar103);
            auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar8));
            auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar7),auVar87);
            auVar103 = vrcp14ps_avx512vl(auVar100);
            auVar101 = auVar189._0_32_;
            auVar102 = vfnmadd213ps_avx512vl(auVar103,auVar100,auVar101);
            auVar80 = vfmadd132ps_fma(auVar102,auVar103,auVar103);
            auVar61._4_4_ = auVar8._4_4_ * auVar124._4_4_;
            auVar61._0_4_ = auVar8._0_4_ * auVar124._0_4_;
            auVar61._8_4_ = auVar8._8_4_ * auVar124._8_4_;
            auVar61._12_4_ = auVar8._12_4_ * auVar124._12_4_;
            auVar61._16_4_ = fVar150 * 0.0;
            auVar61._20_4_ = fVar165 * 0.0;
            auVar61._24_4_ = fVar168 * 0.0;
            auVar61._28_4_ = iVar2;
            auVar81 = vfmadd231ps_fma(auVar61,auVar93,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar92,ZEXT1632(auVar7));
            fVar150 = auVar80._0_4_;
            fVar165 = auVar80._4_4_;
            fVar168 = auVar80._8_4_;
            fVar169 = auVar80._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar169,
                                           CONCAT48(auVar81._8_4_ * fVar168,
                                                    CONCAT44(auVar81._4_4_ * fVar165,
                                                             auVar81._0_4_ * fVar150))));
            auVar63._4_4_ = uStack_35c;
            auVar63._0_4_ = local_360;
            auVar63._8_4_ = uStack_358;
            auVar63._12_4_ = uStack_354;
            auVar63._16_4_ = uStack_350;
            auVar63._20_4_ = uStack_34c;
            auVar63._24_4_ = uStack_348;
            auVar63._28_4_ = uStack_344;
            uVar144 = vcmpps_avx512vl(local_240,auVar63,0xd);
            uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar26._4_4_ = uVar138;
            auVar26._0_4_ = uVar138;
            auVar26._8_4_ = uVar138;
            auVar26._12_4_ = uVar138;
            auVar26._16_4_ = uVar138;
            auVar26._20_4_ = uVar138;
            auVar26._24_4_ = uVar138;
            auVar26._28_4_ = uVar138;
            uVar22 = vcmpps_avx512vl(local_240,auVar26,2);
            bVar74 = (byte)uVar144 & (byte)uVar22 & bVar74;
            if (bVar74 != 0) {
              uVar144 = vcmpps_avx512vl(auVar100,auVar87,4);
              bVar74 = bVar74 & (byte)uVar144;
              auVar181 = ZEXT3264(local_560);
              auVar180 = ZEXT3264(local_580);
              if (bVar74 != 0) {
                fVar162 = auVar104._0_4_ * fVar150;
                fVar161 = auVar104._4_4_ * fVar165;
                auVar62._4_4_ = fVar161;
                auVar62._0_4_ = fVar162;
                fVar163 = auVar104._8_4_ * fVar168;
                auVar62._8_4_ = fVar163;
                fVar77 = auVar104._12_4_ * fVar169;
                auVar62._12_4_ = fVar77;
                fVar78 = auVar104._16_4_ * 0.0;
                auVar62._16_4_ = fVar78;
                fVar130 = auVar104._20_4_ * 0.0;
                auVar62._20_4_ = fVar130;
                fVar131 = auVar104._24_4_ * 0.0;
                auVar62._24_4_ = fVar131;
                auVar62._28_4_ = auVar100._28_4_;
                auVar103 = vsubps_avx512vl(auVar101,auVar62);
                local_280._0_4_ =
                     (float)((uint)(bVar66 & 1) * (int)fVar162 |
                            (uint)!(bool)(bVar66 & 1) * auVar103._0_4_);
                bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar16 * (int)fVar161 | (uint)!bVar16 * auVar103._4_4_);
                bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar16 * (int)fVar163 | (uint)!bVar16 * auVar103._8_4_);
                bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar16 * (int)fVar77 | (uint)!bVar16 * auVar103._12_4_);
                bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar16 * (int)fVar78 | (uint)!bVar16 * auVar103._16_4_);
                bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar103._20_4_);
                bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar16 * (int)fVar131 | (uint)!bVar16 * auVar103._24_4_);
                bVar16 = SUB81(uVar76 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar16 * auVar100._28_4_ | (uint)!bVar16 * auVar103._28_4_);
                auVar100 = vsubps_avx(ZEXT1632(auVar79),auVar106);
                auVar80 = vfmadd213ps_fma(auVar100,local_280,auVar106);
                uVar138 = *(undefined4 *)((long)local_5e0->ray_space + k * 4 + -0x10);
                auVar27._4_4_ = uVar138;
                auVar27._0_4_ = uVar138;
                auVar27._8_4_ = uVar138;
                auVar27._12_4_ = uVar138;
                auVar27._16_4_ = uVar138;
                auVar27._20_4_ = uVar138;
                auVar27._24_4_ = uVar138;
                auVar27._28_4_ = uVar138;
                auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                              CONCAT48(auVar80._8_4_ + auVar80._8_4_
                                                                       ,CONCAT44(auVar80._4_4_ +
                                                                                 auVar80._4_4_,
                                                                                 auVar80._0_4_ +
                                                                                 auVar80._0_4_)))),
                                           auVar27);
                uVar144 = vcmpps_avx512vl(local_240,auVar100,6);
                if (((byte)uVar144 & bVar74) != 0) {
                  auVar147._0_4_ = auVar105._0_4_ * fVar150;
                  auVar147._4_4_ = auVar105._4_4_ * fVar165;
                  auVar147._8_4_ = auVar105._8_4_ * fVar168;
                  auVar147._12_4_ = auVar105._12_4_ * fVar169;
                  auVar147._16_4_ = auVar105._16_4_ * 0.0;
                  auVar147._20_4_ = auVar105._20_4_ * 0.0;
                  auVar147._24_4_ = auVar105._24_4_ * 0.0;
                  auVar147._28_4_ = 0;
                  auVar100 = vsubps_avx512vl(auVar101,auVar147);
                  auVar129._0_4_ =
                       (uint)(bVar66 & 1) * (int)auVar147._0_4_ |
                       (uint)!(bool)(bVar66 & 1) * auVar100._0_4_;
                  bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar16 * (int)auVar147._4_4_ | (uint)!bVar16 * auVar100._4_4_;
                  bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar16 * (int)auVar147._8_4_ | (uint)!bVar16 * auVar100._8_4_;
                  bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar16 * (int)auVar147._12_4_ | (uint)!bVar16 * auVar100._12_4_;
                  bVar16 = (bool)((byte)(uVar76 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar16 * (int)auVar147._16_4_ | (uint)!bVar16 * auVar100._16_4_;
                  bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar16 * (int)auVar147._20_4_ | (uint)!bVar16 * auVar100._20_4_;
                  bVar16 = (bool)((byte)(uVar76 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar16 * (int)auVar147._24_4_ | (uint)!bVar16 * auVar100._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar100._28_4_;
                  auVar28._8_4_ = 0x40000000;
                  auVar28._0_8_ = 0x4000000040000000;
                  auVar28._12_4_ = 0x40000000;
                  auVar28._16_4_ = 0x40000000;
                  auVar28._20_4_ = 0x40000000;
                  auVar28._24_4_ = 0x40000000;
                  auVar28._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar129,auVar101,auVar28);
                  local_220 = (undefined4)lVar73;
                  local_210 = local_4f0._0_8_;
                  uStack_208 = local_4f0._8_8_;
                  local_200 = local_500._0_8_;
                  uStack_1f8 = local_500._8_8_;
                  local_1f0 = local_510._0_8_;
                  uStack_1e8 = local_510._8_8_;
                  pGVar71 = (pRVar65->scene->geometries).items[local_5d8].ptr;
                  if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar66 = 0;
                  }
                  else if ((pRVar65->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar66 = 1, pGVar71->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar80 = vcvtsi2ss_avx512f(auVar182._0_16_,local_220);
                    fVar150 = auVar80._0_4_;
                    local_1c0[0] = (fVar150 + local_280._0_4_ + 0.0) * local_380;
                    local_1c0[1] = (fVar150 + local_280._4_4_ + 1.0) * fStack_37c;
                    local_1c0[2] = (fVar150 + local_280._8_4_ + 2.0) * fStack_378;
                    local_1c0[3] = (fVar150 + local_280._12_4_ + 3.0) * fStack_374;
                    fStack_1b0 = (fVar150 + local_280._16_4_ + 4.0) * fStack_370;
                    fStack_1ac = (fVar150 + local_280._20_4_ + 5.0) * fStack_36c;
                    fStack_1a8 = (fVar150 + local_280._24_4_ + 6.0) * fStack_368;
                    fStack_1a4 = fVar150 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    uVar76 = 0;
                    uVar70 = (ulong)((byte)uVar144 & bVar74);
                    for (uVar75 = uVar70; local_5c0 = pGVar71, local_21c = iVar12, (uVar75 & 1) == 0
                        ; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                      uVar76 = uVar76 + 1;
                    }
                    while (auVar80 = auVar182._0_16_, uVar70 != 0) {
                      uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_2e0 = local_1c0[uVar76];
                      local_2d0 = *(undefined4 *)(local_1a0 + uVar76 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar76 * 4);
                      local_5b0.context = pRVar65->user;
                      fVar165 = 1.0 - local_2e0;
                      fVar150 = fVar165 * fVar165 * -3.0;
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * fVar165)),
                                                ZEXT416((uint)(local_2e0 * fVar165)),
                                                ZEXT416(0xc0000000));
                      auVar79 = vfmsub132ss_fma(ZEXT416((uint)(local_2e0 * fVar165)),
                                                ZEXT416((uint)(local_2e0 * local_2e0)),
                                                ZEXT416(0x40000000));
                      fVar165 = auVar80._0_4_ * 3.0;
                      fVar168 = auVar79._0_4_ * 3.0;
                      fVar169 = local_2e0 * local_2e0 * 3.0;
                      auVar160._0_4_ = fVar169 * (float)local_390._0_4_;
                      auVar160._4_4_ = fVar169 * (float)local_390._4_4_;
                      auVar160._8_4_ = fVar169 * fStack_388;
                      auVar160._12_4_ = fVar169 * fStack_384;
                      auVar142._4_4_ = fVar168;
                      auVar142._0_4_ = fVar168;
                      auVar142._8_4_ = fVar168;
                      auVar142._12_4_ = fVar168;
                      auVar80 = vfmadd132ps_fma(auVar142,auVar160,local_510);
                      auVar152._4_4_ = fVar165;
                      auVar152._0_4_ = fVar165;
                      auVar152._8_4_ = fVar165;
                      auVar152._12_4_ = fVar165;
                      auVar80 = vfmadd132ps_fma(auVar152,auVar80,local_500);
                      auVar143._4_4_ = fVar150;
                      auVar143._0_4_ = fVar150;
                      auVar143._8_4_ = fVar150;
                      auVar143._12_4_ = fVar150;
                      auVar80 = vfmadd132ps_fma(auVar143,auVar80,local_4f0);
                      local_310 = auVar80._0_4_;
                      local_300 = vshufps_avx(auVar80,auVar80,0x55);
                      local_2f0 = vshufps_avx(auVar80,auVar80,0xaa);
                      local_2c0 = local_3a0._0_8_;
                      uStack_2b8 = local_3a0._8_8_;
                      local_2b0 = local_520;
                      vpcmpeqd_avx2(ZEXT1632(local_520),ZEXT1632(local_520));
                      uStack_29c = (local_5b0.context)->instID[0];
                      local_2a0 = uStack_29c;
                      uStack_298 = uStack_29c;
                      uStack_294 = uStack_29c;
                      uStack_290 = (local_5b0.context)->instPrimID[0];
                      uStack_28c = uStack_290;
                      uStack_288 = uStack_290;
                      uStack_284 = uStack_290;
                      local_5f0 = local_3b0;
                      local_5b0.valid = (int *)local_5f0;
                      local_5b0.geometryUserPtr = pGVar71->userPtr;
                      local_5b0.hit = (RTCHitN *)&local_310;
                      local_5b0.N = 4;
                      local_530._0_8_ = uVar70;
                      local_5d0._0_8_ = uVar76;
                      uVar75 = uVar76;
                      local_5b0.ray = (RTCRayN *)ray;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      fStack_2dc = local_2e0;
                      fStack_2d8 = local_2e0;
                      fStack_2d4 = local_2e0;
                      uStack_2cc = local_2d0;
                      uStack_2c8 = local_2d0;
                      uStack_2c4 = local_2d0;
                      if (pGVar71->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar71->occlusionFilterN)(&local_5b0);
                        uVar70 = local_530._0_8_;
                        uVar75 = local_5d0._0_8_;
                        pGVar71 = local_5c0;
                      }
                      uVar76 = vptestmd_avx512vl(local_5f0,local_5f0);
                      if ((uVar76 & 0xf) != 0) {
                        p_Var15 = pRVar65->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar65->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_5b0);
                          uVar70 = local_530._0_8_;
                          uVar75 = local_5d0._0_8_;
                          pGVar71 = local_5c0;
                        }
                        auVar80 = auVar182._0_16_;
                        auVar79 = *(undefined1 (*) [16])(local_5b0.ray + 0x80);
                        uVar76 = vptestmd_avx512vl(local_5f0,local_5f0);
                        uVar76 = uVar76 & 0xf;
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar16 = (bool)((byte)uVar76 & 1);
                        auVar86._0_4_ = (uint)bVar16 * auVar81._0_4_ | (uint)!bVar16 * auVar79._0_4_
                        ;
                        bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
                        auVar86._4_4_ = (uint)bVar16 * auVar81._4_4_ | (uint)!bVar16 * auVar79._4_4_
                        ;
                        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
                        auVar86._8_4_ = (uint)bVar16 * auVar81._8_4_ | (uint)!bVar16 * auVar79._8_4_
                        ;
                        bVar16 = SUB81(uVar76 >> 3,0);
                        auVar86._12_4_ =
                             (uint)bVar16 * auVar81._12_4_ | (uint)!bVar16 * auVar79._12_4_;
                        *(undefined1 (*) [16])(local_5b0.ray + 0x80) = auVar86;
                        if ((byte)uVar76 != 0) {
                          bVar66 = 1;
                          goto LAB_01b05eeb;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar138;
                      uVar76 = 0;
                      uVar70 = uVar70 ^ 1L << (uVar75 & 0x3f);
                      for (uVar75 = uVar70; (uVar75 & 1) == 0;
                          uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                        uVar76 = uVar76 + 1;
                      }
                    }
                    bVar66 = 0;
LAB_01b05eeb:
                    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar189 = ZEXT3264(auVar100);
                    auVar80 = vxorps_avx512vl(auVar80,auVar80);
                    auVar182 = ZEXT1664(auVar80);
                    auVar183 = ZEXT3264(local_3e0);
                    auVar184 = ZEXT3264(local_400);
                    auVar185 = ZEXT3264(local_420);
                    auVar181 = ZEXT3264(local_560);
                    auVar180 = ZEXT3264(local_580);
                    auVar186 = ZEXT3264(local_4e0);
                    auVar187 = ZEXT3264(local_4a0);
                    auVar188 = ZEXT3264(local_4c0);
                  }
                  bVar69 = (bool)(bVar69 | bVar66);
                }
              }
              goto LAB_01b05eca;
            }
          }
          auVar181 = ZEXT3264(local_560);
          auVar180 = ZEXT3264(local_580);
        }
LAB_01b05eca:
      }
    }
    if (bVar69) break;
    uVar138 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar25._4_4_ = uVar138;
    auVar25._0_4_ = uVar138;
    auVar25._8_4_ = uVar138;
    auVar25._12_4_ = uVar138;
    auVar25._16_4_ = uVar138;
    auVar25._20_4_ = uVar138;
    auVar25._24_4_ = uVar138;
    auVar25._28_4_ = uVar138;
    uVar144 = vcmpps_avx512vl(local_80,auVar25,2);
    context = pRVar65;
  }
  return uVar72 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }